

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  int iVar15;
  Geometry *pGVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  long lVar69;
  byte bVar70;
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  Geometry *geometry;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  long lVar75;
  bool bVar76;
  ulong uVar77;
  byte bVar78;
  float fVar79;
  float fVar80;
  float fVar124;
  float fVar125;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar85 [16];
  float fVar126;
  float fVar128;
  float fVar129;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar127;
  float fVar130;
  float fVar131;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar132;
  undefined4 uVar133;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined8 uVar139;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar161;
  float fVar163;
  undefined1 auVar162 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  RTCFilterFunctionNArguments args;
  int local_54c;
  Ray *local_548;
  Primitive *local_540;
  Precalculations *local_538;
  undefined4 local_52c;
  ulong local_528;
  undefined1 local_520 [16];
  RTCFilterFunctionNArguments local_510;
  undefined8 local_4e0;
  undefined4 local_4d8;
  float local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  uint local_4c4;
  uint local_4c0;
  Geometry *local_4b0;
  RayQueryContext *local_4a8;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar14 = prim[1];
  uVar72 = (ulong)(byte)PVar14;
  lVar69 = uVar72 * 0x19;
  fVar161 = *(float *)(prim + lVar69 + 0x12);
  local_538 = pre;
  auVar140 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar69 + 6));
  fVar150 = fVar161 * auVar140._0_4_;
  fVar132 = fVar161 * (ray->dir).field_0.m128[0];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar92 = vpmovsxbd_avx2(auVar82);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar89 = vpmovsxbd_avx2(auVar81);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar90 = vpmovsxbd_avx2(auVar177);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar91 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar14 * 0xc) + 6);
  auVar96 = vpmovsxbd_avx2(auVar9);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar94 = vcvtdq2ps_avx(auVar96);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (uint)(byte)PVar14 * 0xc + uVar72 + 6);
  auVar93 = vpmovsxbd_avx2(auVar10);
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar77 = (ulong)(uint)((int)(uVar72 * 9) * 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar102 = vpmovsxbd_avx2(auVar11);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar77 + uVar72 + 6);
  auVar101 = vpmovsxbd_avx2(auVar12);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar74 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar88 = vpmovsxbd_avx2(auVar13);
  auVar95 = vcvtdq2ps_avx(auVar88);
  auVar171._4_4_ = fVar132;
  auVar171._0_4_ = fVar132;
  auVar171._8_4_ = fVar132;
  auVar171._12_4_ = fVar132;
  auVar171._16_4_ = fVar132;
  auVar171._20_4_ = fVar132;
  auVar171._24_4_ = fVar132;
  auVar171._28_4_ = fVar132;
  auVar173._8_4_ = 1;
  auVar173._0_8_ = 0x100000001;
  auVar173._12_4_ = 1;
  auVar173._16_4_ = 1;
  auVar173._20_4_ = 1;
  auVar173._24_4_ = 1;
  auVar173._28_4_ = 1;
  auVar86 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar98 = ZEXT1632(CONCAT412(fVar161 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar161 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar161 * (ray->dir).field_0.m128[1],fVar132))));
  auVar97 = vpermps_avx2(auVar173,auVar98);
  auVar87 = vpermps_avx512vl(auVar86,auVar98);
  fVar132 = auVar87._0_4_;
  fVar136 = auVar87._4_4_;
  auVar98._4_4_ = fVar136 * auVar90._4_4_;
  auVar98._0_4_ = fVar132 * auVar90._0_4_;
  fVar137 = auVar87._8_4_;
  auVar98._8_4_ = fVar137 * auVar90._8_4_;
  fVar138 = auVar87._12_4_;
  auVar98._12_4_ = fVar138 * auVar90._12_4_;
  fVar163 = auVar87._16_4_;
  auVar98._16_4_ = fVar163 * auVar90._16_4_;
  fVar79 = auVar87._20_4_;
  auVar98._20_4_ = fVar79 * auVar90._20_4_;
  fVar80 = auVar87._24_4_;
  auVar98._24_4_ = fVar80 * auVar90._24_4_;
  auVar98._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar93._4_4_ * fVar136;
  auVar96._0_4_ = auVar93._0_4_ * fVar132;
  auVar96._8_4_ = auVar93._8_4_ * fVar137;
  auVar96._12_4_ = auVar93._12_4_ * fVar138;
  auVar96._16_4_ = auVar93._16_4_ * fVar163;
  auVar96._20_4_ = auVar93._20_4_ * fVar79;
  auVar96._24_4_ = auVar93._24_4_ * fVar80;
  auVar96._28_4_ = auVar88._28_4_;
  auVar88._4_4_ = auVar95._4_4_ * fVar136;
  auVar88._0_4_ = auVar95._0_4_ * fVar132;
  auVar88._8_4_ = auVar95._8_4_ * fVar137;
  auVar88._12_4_ = auVar95._12_4_ * fVar138;
  auVar88._16_4_ = auVar95._16_4_ * fVar163;
  auVar88._20_4_ = auVar95._20_4_ * fVar79;
  auVar88._24_4_ = auVar95._24_4_ * fVar80;
  auVar88._28_4_ = auVar87._28_4_;
  auVar82 = vfmadd231ps_fma(auVar98,auVar97,auVar89);
  auVar81 = vfmadd231ps_fma(auVar96,auVar97,auVar94);
  auVar177 = vfmadd231ps_fma(auVar88,auVar101,auVar97);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar171,auVar92);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar171,auVar91);
  auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar102,auVar171);
  auVar172._4_4_ = fVar150;
  auVar172._0_4_ = fVar150;
  auVar172._8_4_ = fVar150;
  auVar172._12_4_ = fVar150;
  auVar172._16_4_ = fVar150;
  auVar172._20_4_ = fVar150;
  auVar172._24_4_ = fVar150;
  auVar172._28_4_ = fVar150;
  auVar88 = ZEXT1632(CONCAT412(fVar161 * auVar140._12_4_,
                               CONCAT48(fVar161 * auVar140._8_4_,
                                        CONCAT44(fVar161 * auVar140._4_4_,fVar150))));
  auVar96 = vpermps_avx2(auVar173,auVar88);
  auVar88 = vpermps_avx512vl(auVar86,auVar88);
  fVar161 = auVar88._0_4_;
  fVar132 = auVar88._4_4_;
  auVar97._4_4_ = fVar132 * auVar90._4_4_;
  auVar97._0_4_ = fVar161 * auVar90._0_4_;
  fVar136 = auVar88._8_4_;
  auVar97._8_4_ = fVar136 * auVar90._8_4_;
  fVar137 = auVar88._12_4_;
  auVar97._12_4_ = fVar137 * auVar90._12_4_;
  fVar138 = auVar88._16_4_;
  auVar97._16_4_ = fVar138 * auVar90._16_4_;
  fVar163 = auVar88._20_4_;
  auVar97._20_4_ = fVar163 * auVar90._20_4_;
  fVar79 = auVar88._24_4_;
  auVar97._24_4_ = fVar79 * auVar90._24_4_;
  auVar97._28_4_ = 1;
  auVar86._4_4_ = auVar93._4_4_ * fVar132;
  auVar86._0_4_ = auVar93._0_4_ * fVar161;
  auVar86._8_4_ = auVar93._8_4_ * fVar136;
  auVar86._12_4_ = auVar93._12_4_ * fVar137;
  auVar86._16_4_ = auVar93._16_4_ * fVar138;
  auVar86._20_4_ = auVar93._20_4_ * fVar163;
  auVar86._24_4_ = auVar93._24_4_ * fVar79;
  auVar86._28_4_ = auVar90._28_4_;
  auVar93._4_4_ = auVar95._4_4_ * fVar132;
  auVar93._0_4_ = auVar95._0_4_ * fVar161;
  auVar93._8_4_ = auVar95._8_4_ * fVar136;
  auVar93._12_4_ = auVar95._12_4_ * fVar137;
  auVar93._16_4_ = auVar95._16_4_ * fVar138;
  auVar93._20_4_ = auVar95._20_4_ * fVar163;
  auVar93._24_4_ = auVar95._24_4_ * fVar79;
  auVar93._28_4_ = auVar88._28_4_;
  auVar8 = vfmadd231ps_fma(auVar97,auVar96,auVar89);
  auVar9 = vfmadd231ps_fma(auVar86,auVar96,auVar94);
  auVar10 = vfmadd231ps_fma(auVar93,auVar96,auVar101);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar172,auVar92);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar172,auVar91);
  auVar164._8_4_ = 0x7fffffff;
  auVar164._0_8_ = 0x7fffffff7fffffff;
  auVar164._12_4_ = 0x7fffffff;
  auVar164._16_4_ = 0x7fffffff;
  auVar164._20_4_ = 0x7fffffff;
  auVar164._24_4_ = 0x7fffffff;
  auVar164._28_4_ = 0x7fffffff;
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar172,auVar102);
  auVar92 = vandps_avx(ZEXT1632(auVar82),auVar164);
  auVar162._8_4_ = 0x219392ef;
  auVar162._0_8_ = 0x219392ef219392ef;
  auVar162._12_4_ = 0x219392ef;
  auVar162._16_4_ = 0x219392ef;
  auVar162._20_4_ = 0x219392ef;
  auVar162._24_4_ = 0x219392ef;
  auVar162._28_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar92,auVar162,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar87._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar92 = vandps_avx(ZEXT1632(auVar81),auVar164);
  uVar77 = vcmpps_avx512vl(auVar92,auVar162,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar99._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar92 = vandps_avx(ZEXT1632(auVar177),auVar164);
  uVar77 = vcmpps_avx512vl(auVar92,auVar162,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar92._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar177._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar177._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar177._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar177._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar89 = vrcp14ps_avx512vl(auVar87);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar91 = vfnmadd213ps_avx512vl(auVar87,auVar89,auVar90);
  auVar82 = vfmadd132ps_fma(auVar91,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar99);
  auVar91 = vfnmadd213ps_avx512vl(auVar99,auVar89,auVar90);
  auVar81 = vfmadd132ps_fma(auVar91,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar92);
  auVar92 = vfnmadd213ps_avx512vl(auVar92,auVar89,auVar90);
  auVar177 = vfmadd132ps_fma(auVar92,auVar89,auVar89);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar8));
  auVar102._4_4_ = auVar82._4_4_ * auVar92._4_4_;
  auVar102._0_4_ = auVar82._0_4_ * auVar92._0_4_;
  auVar102._8_4_ = auVar82._8_4_ * auVar92._8_4_;
  auVar102._12_4_ = auVar82._12_4_ * auVar92._12_4_;
  auVar102._16_4_ = auVar92._16_4_ * 0.0;
  auVar102._20_4_ = auVar92._20_4_ * 0.0;
  auVar102._24_4_ = auVar92._24_4_ * 0.0;
  auVar102._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar8));
  auVar93 = vpbroadcastd_avx512vl();
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar14 * 0x10 + 6));
  auVar148._0_4_ = auVar82._0_4_ * auVar92._0_4_;
  auVar148._4_4_ = auVar82._4_4_ * auVar92._4_4_;
  auVar148._8_4_ = auVar82._8_4_ * auVar92._8_4_;
  auVar148._12_4_ = auVar82._12_4_ * auVar92._12_4_;
  auVar148._16_4_ = auVar92._16_4_ * 0.0;
  auVar148._20_4_ = auVar92._20_4_ * 0.0;
  auVar148._24_4_ = auVar92._24_4_ * 0.0;
  auVar148._28_4_ = 0;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar14 * 0x10 + uVar72 * -2 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar9));
  auVar101._4_4_ = auVar81._4_4_ * auVar92._4_4_;
  auVar101._0_4_ = auVar81._0_4_ * auVar92._0_4_;
  auVar101._8_4_ = auVar81._8_4_ * auVar92._8_4_;
  auVar101._12_4_ = auVar81._12_4_ * auVar92._12_4_;
  auVar101._16_4_ = auVar92._16_4_ * 0.0;
  auVar101._20_4_ = auVar92._20_4_ * 0.0;
  auVar101._24_4_ = auVar92._24_4_ * 0.0;
  auVar101._28_4_ = auVar92._28_4_;
  auVar92 = vcvtdq2ps_avx(auVar89);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar9));
  auVar142._0_4_ = auVar81._0_4_ * auVar92._0_4_;
  auVar142._4_4_ = auVar81._4_4_ * auVar92._4_4_;
  auVar142._8_4_ = auVar81._8_4_ * auVar92._8_4_;
  auVar142._12_4_ = auVar81._12_4_ * auVar92._12_4_;
  auVar142._16_4_ = auVar92._16_4_ * 0.0;
  auVar142._20_4_ = auVar92._20_4_ * 0.0;
  auVar142._24_4_ = auVar92._24_4_ * 0.0;
  auVar142._28_4_ = 0;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 + uVar72 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar10));
  auVar95._4_4_ = auVar92._4_4_ * auVar177._4_4_;
  auVar95._0_4_ = auVar92._0_4_ * auVar177._0_4_;
  auVar95._8_4_ = auVar92._8_4_ * auVar177._8_4_;
  auVar95._12_4_ = auVar92._12_4_ * auVar177._12_4_;
  auVar95._16_4_ = auVar92._16_4_ * 0.0;
  auVar95._20_4_ = auVar92._20_4_ * 0.0;
  auVar95._24_4_ = auVar92._24_4_ * 0.0;
  auVar95._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x17 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar10));
  auVar100._0_4_ = auVar177._0_4_ * auVar92._0_4_;
  auVar100._4_4_ = auVar177._4_4_ * auVar92._4_4_;
  auVar100._8_4_ = auVar177._8_4_ * auVar92._8_4_;
  auVar100._12_4_ = auVar177._12_4_ * auVar92._12_4_;
  auVar100._16_4_ = auVar92._16_4_ * 0.0;
  auVar100._20_4_ = auVar92._20_4_ * 0.0;
  auVar100._24_4_ = auVar92._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar92 = vpminsd_avx2(auVar102,auVar148);
  auVar89 = vpminsd_avx2(auVar101,auVar142);
  auVar92 = vmaxps_avx(auVar92,auVar89);
  auVar89 = vpminsd_avx2(auVar95,auVar100);
  uVar133 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar90._4_4_ = uVar133;
  auVar90._0_4_ = uVar133;
  auVar90._8_4_ = uVar133;
  auVar90._12_4_ = uVar133;
  auVar90._16_4_ = uVar133;
  auVar90._20_4_ = uVar133;
  auVar90._24_4_ = uVar133;
  auVar90._28_4_ = uVar133;
  auVar89 = vmaxps_avx512vl(auVar89,auVar90);
  auVar92 = vmaxps_avx(auVar92,auVar89);
  auVar89._8_4_ = 0x3f7ffffa;
  auVar89._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar89._12_4_ = 0x3f7ffffa;
  auVar89._16_4_ = 0x3f7ffffa;
  auVar89._20_4_ = 0x3f7ffffa;
  auVar89._24_4_ = 0x3f7ffffa;
  auVar89._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar92,auVar89);
  auVar92 = vpmaxsd_avx2(auVar102,auVar148);
  auVar89 = vpmaxsd_avx2(auVar101,auVar142);
  auVar92 = vminps_avx(auVar92,auVar89);
  auVar89 = vpmaxsd_avx2(auVar95,auVar100);
  fVar161 = ray->tfar;
  auVar91._4_4_ = fVar161;
  auVar91._0_4_ = fVar161;
  auVar91._8_4_ = fVar161;
  auVar91._12_4_ = fVar161;
  auVar91._16_4_ = fVar161;
  auVar91._20_4_ = fVar161;
  auVar91._24_4_ = fVar161;
  auVar91._28_4_ = fVar161;
  auVar89 = vminps_avx512vl(auVar89,auVar91);
  auVar92 = vminps_avx(auVar92,auVar89);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar94);
  uVar24 = vpcmpgtd_avx512vl(auVar93,_DAT_01fe9900);
  uVar139 = vcmpps_avx512vl(local_80,auVar92,2);
  if ((byte)((byte)uVar139 & (byte)uVar24) == 0) {
    bVar76 = false;
  }
  else {
    uVar77 = (ulong)(byte)((byte)uVar139 & (byte)uVar24);
    local_540 = prim;
    do {
      lVar25 = 0;
      for (uVar72 = uVar77; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar77 = uVar77 - 1 & uVar77;
      local_52c = *(undefined4 *)(local_540 + lVar25 * 4 + 6);
      uVar72 = (ulong)(uint)((int)lVar25 << 6);
      local_528 = (ulong)*(uint *)(local_540 + 2);
      pGVar16 = (context->scene->geometries).items[*(uint *)(local_540 + 2)].ptr;
      local_470 = *(undefined1 (*) [16])(prim + uVar72 + lVar69 + 0x16);
      if (uVar77 != 0) {
        uVar73 = uVar77 - 1 & uVar77;
        for (uVar74 = uVar77; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
        }
        if (uVar73 != 0) {
          for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_480 = *(undefined1 (*) [16])(prim + uVar72 + lVar69 + 0x26);
      local_490 = *(undefined1 (*) [16])(prim + uVar72 + lVar69 + 0x36);
      _local_310 = *(undefined1 (*) [16])(prim + uVar72 + lVar69 + 0x46);
      iVar15 = (int)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar3 = (ray->org).field_0;
      auVar81 = vsubps_avx(local_470,(undefined1  [16])aVar3);
      uVar133 = auVar81._0_4_;
      auVar140._4_4_ = uVar133;
      auVar140._0_4_ = uVar133;
      auVar140._8_4_ = uVar133;
      auVar140._12_4_ = uVar133;
      auVar82 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar161 = (pre->ray_space).vz.field_0.m128[0];
      fVar132 = (pre->ray_space).vz.field_0.m128[1];
      fVar136 = (pre->ray_space).vz.field_0.m128[2];
      fVar137 = (pre->ray_space).vz.field_0.m128[3];
      auVar166._0_4_ = auVar81._0_4_ * fVar161;
      auVar166._4_4_ = auVar81._4_4_ * fVar132;
      auVar166._8_4_ = auVar81._8_4_ * fVar136;
      auVar166._12_4_ = auVar81._12_4_ * fVar137;
      auVar82 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar5,auVar82);
      auVar177 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar140);
      auVar81 = vsubps_avx(local_480,(undefined1  [16])aVar3);
      uVar133 = auVar81._0_4_;
      auVar83._4_4_ = uVar133;
      auVar83._0_4_ = uVar133;
      auVar83._8_4_ = uVar133;
      auVar83._12_4_ = uVar133;
      auVar82 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar167._0_4_ = auVar81._0_4_ * fVar161;
      auVar167._4_4_ = auVar81._4_4_ * fVar132;
      auVar167._8_4_ = auVar81._8_4_ * fVar136;
      auVar167._12_4_ = auVar81._12_4_ * fVar137;
      auVar82 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar5,auVar82);
      auVar8 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar83);
      auVar81 = vsubps_avx512vl(local_490,(undefined1  [16])aVar3);
      uVar133 = auVar81._0_4_;
      auVar84._4_4_ = uVar133;
      auVar84._0_4_ = uVar133;
      auVar84._8_4_ = uVar133;
      auVar84._12_4_ = uVar133;
      auVar82 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar85._0_4_ = auVar81._0_4_ * fVar161;
      auVar85._4_4_ = auVar81._4_4_ * fVar132;
      auVar85._8_4_ = auVar81._8_4_ * fVar136;
      auVar85._12_4_ = auVar81._12_4_ * fVar137;
      auVar82 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar5,auVar82);
      auVar9 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar84);
      local_2e0 = ZEXT1632((undefined1  [16])aVar3);
      auVar81 = vsubps_avx512vl(_local_310,(undefined1  [16])aVar3);
      uVar133 = auVar81._0_4_;
      auVar141._4_4_ = uVar133;
      auVar141._0_4_ = uVar133;
      auVar141._8_4_ = uVar133;
      auVar141._12_4_ = uVar133;
      auVar82 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar169._0_4_ = auVar81._0_4_ * fVar161;
      auVar169._4_4_ = auVar81._4_4_ * fVar132;
      auVar169._8_4_ = auVar81._8_4_ * fVar136;
      auVar169._12_4_ = auVar81._12_4_ * fVar137;
      auVar82 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar5,auVar82);
      auVar10 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar141);
      lVar25 = (long)iVar15 * 0x44;
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      local_340 = vbroadcastss_avx512vl(auVar177);
      auVar134._8_4_ = 1;
      auVar134._0_8_ = 0x100000001;
      auVar134._12_4_ = 1;
      auVar134._16_4_ = 1;
      auVar134._20_4_ = 1;
      auVar134._24_4_ = 1;
      auVar134._28_4_ = 1;
      local_360 = vpermps_avx2(auVar134,ZEXT1632(auVar177));
      auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      uVar133 = auVar8._0_4_;
      local_3e0._4_4_ = uVar133;
      local_3e0._0_4_ = uVar133;
      local_3e0._8_4_ = uVar133;
      local_3e0._12_4_ = uVar133;
      local_3e0._16_4_ = uVar133;
      local_3e0._20_4_ = uVar133;
      local_3e0._24_4_ = uVar133;
      local_3e0._28_4_ = uVar133;
      auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      local_380 = vpermps_avx2(auVar134,ZEXT1632(auVar8));
      local_400 = vbroadcastss_avx512vl(auVar9);
      local_420 = vpermps_avx512vl(auVar134,ZEXT1632(auVar9));
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0xd8c);
      fVar161 = auVar10._0_4_;
      local_3a0._4_4_ = fVar161;
      local_3a0._0_4_ = fVar161;
      local_3a0._8_4_ = fVar161;
      local_3a0._12_4_ = fVar161;
      local_3a0._16_4_ = fVar161;
      local_3a0._20_4_ = fVar161;
      local_3a0._24_4_ = fVar161;
      local_3a0._28_4_ = fVar161;
      local_440 = vpermps_avx512vl(auVar134,ZEXT1632(auVar10));
      auVar94 = vmulps_avx512vl(local_3a0,auVar91);
      auVar93 = vmulps_avx512vl(local_440,auVar91);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_400);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,local_420);
      auVar82 = vfmadd231ps_fma(auVar94,auVar89,local_3e0);
      auVar81 = vfmadd231ps_fma(auVar93,auVar89,local_380);
      auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar92,local_340);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar92,local_360);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0xd8c);
      auVar88 = vmulps_avx512vl(local_3a0,auVar101);
      auVar97 = vmulps_avx512vl(local_440,auVar101);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_400);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_420);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,local_3e0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_380);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,local_340);
      auVar11 = vfmadd231ps_fma(auVar97,auVar94,local_360);
      auVar97 = vsubps_avx512vl(auVar88,auVar95);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar11),auVar96);
      auVar86 = vmulps_avx512vl(auVar96,auVar97);
      auVar87 = vmulps_avx512vl(auVar95,auVar98);
      auVar86 = vsubps_avx512vl(auVar86,auVar87);
      auVar82 = vshufps_avx(local_470,local_470,0xff);
      uVar139 = auVar82._0_8_;
      local_a0._8_8_ = uVar139;
      local_a0._0_8_ = uVar139;
      local_a0._16_8_ = uVar139;
      local_a0._24_8_ = uVar139;
      auVar82 = vshufps_avx(local_480,local_480,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(local_490,local_490,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(_local_310,_local_310,0xff);
      uVar139 = auVar82._0_8_;
      register0x000012c8 = uVar139;
      local_100 = uVar139;
      register0x000012d0 = uVar139;
      register0x000012d8 = uVar139;
      auVar87 = vmulps_avx512vl(_local_100,auVar91);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,local_e0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,local_c0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,local_a0);
      auVar99 = vmulps_avx512vl(_local_100,auVar101);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,local_c0);
      auVar12 = vfmadd231ps_fma(auVar99,auVar94,local_a0);
      auVar99 = vmulps_avx512vl(auVar98,auVar98);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar97);
      auVar100 = vmaxps_avx512vl(auVar87,ZEXT1632(auVar12));
      auVar100 = vmulps_avx512vl(auVar100,auVar100);
      auVar99 = vmulps_avx512vl(auVar100,auVar99);
      auVar86 = vmulps_avx512vl(auVar86,auVar86);
      uVar139 = vcmpps_avx512vl(auVar86,auVar99,2);
      auVar82 = vblendps_avx(auVar177,local_470,8);
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar81 = vandps_avx512vl(auVar82,auVar83);
      auVar140 = local_480;
      auVar82 = vblendps_avx(auVar8,local_480,8);
      auVar82 = vandps_avx512vl(auVar82,auVar83);
      auVar81 = vmaxps_avx(auVar81,auVar82);
      auVar13 = local_490;
      auVar82 = vblendps_avx(auVar9,local_490,8);
      auVar84 = vandps_avx512vl(auVar82,auVar83);
      auVar82 = vblendps_avx(auVar10,_local_310,8);
      auVar82 = vandps_avx512vl(auVar82,auVar83);
      auVar82 = vmaxps_avx(auVar84,auVar82);
      auVar82 = vmaxps_avx(auVar81,auVar82);
      auVar81 = vmovshdup_avx(auVar82);
      auVar81 = vmaxss_avx(auVar81,auVar82);
      auVar82 = vshufpd_avx(auVar82,auVar82,1);
      auVar82 = vmaxss_avx(auVar82,auVar81);
      _local_300 = vcvtsi2ss_avx512f(_local_310,iVar15);
      auVar170._0_4_ = local_300._0_4_;
      auVar170._4_4_ = auVar170._0_4_;
      auVar170._8_4_ = auVar170._0_4_;
      auVar170._12_4_ = auVar170._0_4_;
      auVar170._16_4_ = auVar170._0_4_;
      auVar170._20_4_ = auVar170._0_4_;
      auVar170._24_4_ = auVar170._0_4_;
      auVar170._28_4_ = auVar170._0_4_;
      uVar24 = vcmpps_avx512vl(auVar170,_DAT_01faff40,0xe);
      bVar78 = (byte)uVar139 & (byte)uVar24;
      auVar149._8_4_ = 2;
      auVar149._0_8_ = 0x200000002;
      auVar149._12_4_ = 2;
      auVar149._16_4_ = 2;
      auVar149._20_4_ = 2;
      auVar149._24_4_ = 2;
      auVar149._28_4_ = 2;
      local_3c0 = vpermps_avx512vl(auVar149,ZEXT1632(auVar177));
      auVar180 = ZEXT3264(local_3c0);
      local_120 = vpermps_avx512vl(auVar149,ZEXT1632(auVar8));
      local_140 = vpermps_avx512vl(auVar149,ZEXT1632(auVar9));
      local_460 = vpermps_avx2(auVar149,ZEXT1632(auVar10));
      auVar81 = auVar101._0_16_;
      auVar82 = ZEXT416((uint)(auVar82._0_4_ * 4.7683716e-07));
      local_548 = ray;
      if (bVar78 == 0) {
        bVar76 = false;
        auVar81 = vxorps_avx512vl(auVar81,auVar81);
        auVar178 = ZEXT1664(auVar81);
        auVar176 = ZEXT3264(local_340);
        auVar182 = ZEXT3264(local_360);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar179 = ZEXT3264(auVar92);
        auVar185 = ZEXT3264(local_3e0);
        auVar181 = ZEXT3264(local_380);
        auVar187 = ZEXT3264(local_400);
        auVar184 = ZEXT3264(local_420);
        auVar183 = ZEXT3264(local_3a0);
        auVar186 = ZEXT3264(local_440);
        local_490 = auVar13;
        local_480 = auVar140;
      }
      else {
        auVar101 = vmulps_avx512vl(local_460,auVar101);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_140,auVar101);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_120,auVar102);
        auVar93 = vfmadd213ps_avx512vl(auVar94,local_3c0,auVar93);
        auVar91 = vmulps_avx512vl(local_460,auVar91);
        auVar90 = vfmadd213ps_avx512vl(auVar90,local_140,auVar91);
        auVar102 = vfmadd213ps_avx512vl(auVar89,local_120,auVar90);
        auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1f9c);
        auVar102 = vfmadd213ps_avx512vl(auVar92,local_3c0,auVar102);
        auVar92 = vmulps_avx512vl(local_3a0,auVar94);
        auVar101 = vmulps_avx512vl(local_440,auVar94);
        auVar94 = vmulps_avx512vl(local_460,auVar94);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,local_400);
        auVar184 = ZEXT3264(local_420);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,local_420);
        auVar91 = vfmadd231ps_avx512vl(auVar94,local_140,auVar91);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar90,local_3e0);
        auVar94 = vfmadd231ps_avx512vl(auVar101,auVar90,local_380);
        auVar101 = vfmadd231ps_avx512vl(auVar91,local_120,auVar90);
        auVar177 = vfmadd231ps_fma(auVar92,auVar89,local_340);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,local_360);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1f9c);
        auVar101 = vfmadd231ps_avx512vl(auVar101,local_3c0,auVar89);
        auVar34._4_4_ = fVar161 * auVar91._4_4_;
        auVar34._0_4_ = fVar161 * auVar91._0_4_;
        auVar34._8_4_ = fVar161 * auVar91._8_4_;
        auVar34._12_4_ = fVar161 * auVar91._12_4_;
        auVar34._16_4_ = fVar161 * auVar91._16_4_;
        auVar34._20_4_ = fVar161 * auVar91._20_4_;
        auVar34._24_4_ = fVar161 * auVar91._24_4_;
        auVar34._28_4_ = auVar89._28_4_;
        auVar89 = vmulps_avx512vl(local_440,auVar91);
        auVar91 = vmulps_avx512vl(local_460,auVar91);
        auVar180 = ZEXT3264(local_3c0);
        auVar86 = vfmadd231ps_avx512vl(auVar34,auVar90,local_400);
        auVar99 = vfmadd231ps_avx512vl(auVar89,auVar90,local_420);
        auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
        auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar91 = vfmadd231ps_avx512vl(auVar86,auVar89,local_3e0);
        auVar86 = vfmadd231ps_avx512vl(auVar99,auVar89,local_380);
        auVar89 = vfmadd231ps_avx512vl(auVar90,local_120,auVar89);
        auVar8 = vfmadd231ps_fma(auVar91,auVar92,local_340);
        auVar90 = vfmadd231ps_avx512vl(auVar86,auVar92,local_360);
        auVar91 = vfmadd231ps_avx512vl(auVar89,local_3c0,auVar92);
        auVar174._8_4_ = 0x7fffffff;
        auVar174._0_8_ = 0x7fffffff7fffffff;
        auVar174._12_4_ = 0x7fffffff;
        auVar174._16_4_ = 0x7fffffff;
        auVar174._20_4_ = 0x7fffffff;
        auVar174._24_4_ = 0x7fffffff;
        auVar174._28_4_ = 0x7fffffff;
        auVar92 = vandps_avx(ZEXT1632(auVar177),auVar174);
        auVar89 = vandps_avx(auVar94,auVar174);
        auVar89 = vmaxps_avx(auVar92,auVar89);
        auVar92 = vandps_avx(auVar101,auVar174);
        auVar92 = vmaxps_avx(auVar89,auVar92);
        auVar101 = vbroadcastss_avx512vl(auVar82);
        uVar72 = vcmpps_avx512vl(auVar92,auVar101,1);
        bVar76 = (bool)((byte)uVar72 & 1);
        auVar103._0_4_ = (float)((uint)bVar76 * auVar97._0_4_ | (uint)!bVar76 * auVar177._0_4_);
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar76 * auVar97._4_4_ | (uint)!bVar76 * auVar177._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar76 * auVar97._8_4_ | (uint)!bVar76 * auVar177._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar76 * auVar97._12_4_ | (uint)!bVar76 * auVar177._12_4_);
        fVar161 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar97._16_4_);
        auVar103._16_4_ = fVar161;
        fVar132 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar97._20_4_);
        auVar103._20_4_ = fVar132;
        fVar136 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar97._24_4_);
        auVar103._24_4_ = fVar136;
        uVar71 = (uint)(byte)(uVar72 >> 7) * auVar97._28_4_;
        auVar103._28_4_ = uVar71;
        bVar76 = (bool)((byte)uVar72 & 1);
        auVar104._0_4_ = (float)((uint)bVar76 * auVar98._0_4_ | (uint)!bVar76 * auVar94._0_4_);
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar76 * auVar98._4_4_ | (uint)!bVar76 * auVar94._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar76 * auVar98._8_4_ | (uint)!bVar76 * auVar94._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar76 * auVar98._12_4_ | (uint)!bVar76 * auVar94._12_4_);
        bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar76 * auVar98._16_4_ | (uint)!bVar76 * auVar94._16_4_);
        bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar76 * auVar98._20_4_ | (uint)!bVar76 * auVar94._20_4_);
        bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar76 * auVar98._24_4_ | (uint)!bVar76 * auVar94._24_4_);
        bVar76 = SUB81(uVar72 >> 7,0);
        auVar104._28_4_ = (uint)bVar76 * auVar98._28_4_ | (uint)!bVar76 * auVar94._28_4_;
        auVar92 = vandps_avx(auVar174,ZEXT1632(auVar8));
        auVar89 = vandps_avx(auVar90,auVar174);
        auVar89 = vmaxps_avx(auVar92,auVar89);
        auVar92 = vandps_avx(auVar91,auVar174);
        auVar92 = vmaxps_avx(auVar89,auVar92);
        uVar72 = vcmpps_avx512vl(auVar92,auVar101,1);
        bVar76 = (bool)((byte)uVar72 & 1);
        auVar105._0_4_ = (float)((uint)bVar76 * auVar97._0_4_ | (uint)!bVar76 * auVar8._0_4_);
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar76 * auVar97._4_4_ | (uint)!bVar76 * auVar8._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar76 * auVar97._8_4_ | (uint)!bVar76 * auVar8._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar76 * auVar97._12_4_ | (uint)!bVar76 * auVar8._12_4_);
        fVar137 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar97._16_4_);
        auVar105._16_4_ = fVar137;
        fVar138 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar97._20_4_);
        auVar105._20_4_ = fVar138;
        fVar163 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar97._24_4_);
        auVar105._24_4_ = fVar163;
        auVar105._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar97._28_4_;
        bVar76 = (bool)((byte)uVar72 & 1);
        auVar106._0_4_ = (float)((uint)bVar76 * auVar98._0_4_ | (uint)!bVar76 * auVar90._0_4_);
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar76 * auVar98._4_4_ | (uint)!bVar76 * auVar90._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar76 * auVar98._8_4_ | (uint)!bVar76 * auVar90._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar76 * auVar98._12_4_ | (uint)!bVar76 * auVar90._12_4_);
        bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar76 * auVar98._16_4_ | (uint)!bVar76 * auVar90._16_4_);
        bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar76 * auVar98._20_4_ | (uint)!bVar76 * auVar90._20_4_);
        bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar76 * auVar98._24_4_ | (uint)!bVar76 * auVar90._24_4_);
        bVar76 = SUB81(uVar72 >> 7,0);
        auVar106._28_4_ = (uint)bVar76 * auVar98._28_4_ | (uint)!bVar76 * auVar90._28_4_;
        auVar85 = vxorps_avx512vl(auVar81,auVar81);
        auVar178 = ZEXT1664(auVar85);
        auVar92 = vfmadd213ps_avx512vl(auVar103,auVar103,ZEXT1632(auVar85));
        auVar81 = vfmadd231ps_fma(auVar92,auVar104,auVar104);
        auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
        fVar79 = auVar92._0_4_;
        fVar80 = auVar92._4_4_;
        fVar150 = auVar92._8_4_;
        fVar124 = auVar92._12_4_;
        fVar125 = auVar92._16_4_;
        fVar126 = auVar92._20_4_;
        fVar128 = auVar92._24_4_;
        auVar35._4_4_ = fVar80 * fVar80 * fVar80 * auVar81._4_4_ * -0.5;
        auVar35._0_4_ = fVar79 * fVar79 * fVar79 * auVar81._0_4_ * -0.5;
        auVar35._8_4_ = fVar150 * fVar150 * fVar150 * auVar81._8_4_ * -0.5;
        auVar35._12_4_ = fVar124 * fVar124 * fVar124 * auVar81._12_4_ * -0.5;
        auVar35._16_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar35._20_4_ = fVar126 * fVar126 * fVar126 * -0.0;
        auVar35._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar35._28_4_ = 0;
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar90 = vfmadd231ps_avx512vl(auVar35,auVar89,auVar92);
        auVar36._4_4_ = auVar104._4_4_ * auVar90._4_4_;
        auVar36._0_4_ = auVar104._0_4_ * auVar90._0_4_;
        auVar36._8_4_ = auVar104._8_4_ * auVar90._8_4_;
        auVar36._12_4_ = auVar104._12_4_ * auVar90._12_4_;
        auVar36._16_4_ = auVar104._16_4_ * auVar90._16_4_;
        auVar36._20_4_ = auVar104._20_4_ * auVar90._20_4_;
        auVar36._24_4_ = auVar104._24_4_ * auVar90._24_4_;
        auVar36._28_4_ = auVar92._28_4_;
        auVar37._4_4_ = auVar90._4_4_ * -auVar103._4_4_;
        auVar37._0_4_ = auVar90._0_4_ * -auVar103._0_4_;
        auVar37._8_4_ = auVar90._8_4_ * -auVar103._8_4_;
        auVar37._12_4_ = auVar90._12_4_ * -auVar103._12_4_;
        auVar37._16_4_ = auVar90._16_4_ * -fVar161;
        auVar37._20_4_ = auVar90._20_4_ * -fVar132;
        auVar37._24_4_ = auVar90._24_4_ * -fVar136;
        auVar37._28_4_ = uVar71 ^ 0x80000000;
        auVar92 = vmulps_avx512vl(auVar90,ZEXT1632(auVar85));
        auVar97 = ZEXT1632(auVar85);
        auVar91 = vfmadd213ps_avx512vl(auVar105,auVar105,auVar97);
        auVar81 = vfmadd231ps_fma(auVar91,auVar106,auVar106);
        auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
        fVar161 = auVar91._0_4_;
        fVar132 = auVar91._4_4_;
        fVar136 = auVar91._8_4_;
        fVar79 = auVar91._12_4_;
        fVar80 = auVar91._16_4_;
        fVar150 = auVar91._20_4_;
        fVar124 = auVar91._24_4_;
        auVar38._4_4_ = fVar132 * fVar132 * fVar132 * auVar81._4_4_ * -0.5;
        auVar38._0_4_ = fVar161 * fVar161 * fVar161 * auVar81._0_4_ * -0.5;
        auVar38._8_4_ = fVar136 * fVar136 * fVar136 * auVar81._8_4_ * -0.5;
        auVar38._12_4_ = fVar79 * fVar79 * fVar79 * auVar81._12_4_ * -0.5;
        auVar38._16_4_ = fVar80 * fVar80 * fVar80 * -0.0;
        auVar38._20_4_ = fVar150 * fVar150 * fVar150 * -0.0;
        auVar38._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar38._28_4_ = 0;
        auVar89 = vfmadd231ps_avx512vl(auVar38,auVar89,auVar91);
        auVar39._4_4_ = auVar106._4_4_ * auVar89._4_4_;
        auVar39._0_4_ = auVar106._0_4_ * auVar89._0_4_;
        auVar39._8_4_ = auVar106._8_4_ * auVar89._8_4_;
        auVar39._12_4_ = auVar106._12_4_ * auVar89._12_4_;
        auVar39._16_4_ = auVar106._16_4_ * auVar89._16_4_;
        auVar39._20_4_ = auVar106._20_4_ * auVar89._20_4_;
        auVar39._24_4_ = auVar106._24_4_ * auVar89._24_4_;
        auVar39._28_4_ = auVar91._28_4_;
        auVar40._4_4_ = -auVar105._4_4_ * auVar89._4_4_;
        auVar40._0_4_ = -auVar105._0_4_ * auVar89._0_4_;
        auVar40._8_4_ = -auVar105._8_4_ * auVar89._8_4_;
        auVar40._12_4_ = -auVar105._12_4_ * auVar89._12_4_;
        auVar40._16_4_ = -fVar137 * auVar89._16_4_;
        auVar40._20_4_ = -fVar138 * auVar89._20_4_;
        auVar40._24_4_ = -fVar163 * auVar89._24_4_;
        auVar40._28_4_ = auVar90._28_4_;
        auVar89 = vmulps_avx512vl(auVar89,auVar97);
        auVar81 = vfmadd213ps_fma(auVar36,auVar87,auVar95);
        auVar177 = vfmadd213ps_fma(auVar37,auVar87,auVar96);
        auVar90 = vfmadd213ps_avx512vl(auVar92,auVar87,auVar102);
        auVar91 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar12),auVar88);
        auVar83 = vfnmadd213ps_fma(auVar36,auVar87,auVar95);
        auVar101 = ZEXT1632(auVar12);
        auVar8 = vfmadd213ps_fma(auVar40,auVar101,ZEXT1632(auVar11));
        auVar84 = vfnmadd213ps_fma(auVar37,auVar87,auVar96);
        auVar9 = vfmadd213ps_fma(auVar89,auVar101,auVar93);
        auVar94 = vfnmadd231ps_avx512vl(auVar102,auVar87,auVar92);
        auVar141 = vfnmadd213ps_fma(auVar39,auVar101,auVar88);
        auVar166 = vfnmadd213ps_fma(auVar40,auVar101,ZEXT1632(auVar11));
        auVar167 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar12),auVar89);
        auVar89 = vsubps_avx512vl(auVar91,ZEXT1632(auVar83));
        auVar92 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar84));
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar9),auVar94);
        auVar102 = vmulps_avx512vl(auVar92,auVar94);
        auVar10 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar84),auVar93);
        auVar41._4_4_ = auVar83._4_4_ * auVar93._4_4_;
        auVar41._0_4_ = auVar83._0_4_ * auVar93._0_4_;
        auVar41._8_4_ = auVar83._8_4_ * auVar93._8_4_;
        auVar41._12_4_ = auVar83._12_4_ * auVar93._12_4_;
        auVar41._16_4_ = auVar93._16_4_ * 0.0;
        auVar41._20_4_ = auVar93._20_4_ * 0.0;
        auVar41._24_4_ = auVar93._24_4_ * 0.0;
        auVar41._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar41,auVar94,auVar89);
        auVar42._4_4_ = auVar84._4_4_ * auVar89._4_4_;
        auVar42._0_4_ = auVar84._0_4_ * auVar89._0_4_;
        auVar42._8_4_ = auVar84._8_4_ * auVar89._8_4_;
        auVar42._12_4_ = auVar84._12_4_ * auVar89._12_4_;
        auVar42._16_4_ = auVar89._16_4_ * 0.0;
        auVar42._20_4_ = auVar89._20_4_ * 0.0;
        auVar42._24_4_ = auVar89._24_4_ * 0.0;
        auVar42._28_4_ = auVar89._28_4_;
        auVar11 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar83),auVar92);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar97,auVar93);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,ZEXT1632(auVar10));
        auVar98 = ZEXT1632(auVar85);
        uVar72 = vcmpps_avx512vl(auVar92,auVar98,2);
        bVar70 = (byte)uVar72;
        fVar79 = (float)((uint)(bVar70 & 1) * auVar81._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar141._0_4_);
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        fVar150 = (float)((uint)bVar76 * auVar81._4_4_ | (uint)!bVar76 * auVar141._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        fVar125 = (float)((uint)bVar76 * auVar81._8_4_ | (uint)!bVar76 * auVar141._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        fVar128 = (float)((uint)bVar76 * auVar81._12_4_ | (uint)!bVar76 * auVar141._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar125,CONCAT44(fVar150,fVar79))));
        fVar80 = (float)((uint)(bVar70 & 1) * auVar177._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar166._0_4_);
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        fVar124 = (float)((uint)bVar76 * auVar177._4_4_ | (uint)!bVar76 * auVar166._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        fVar126 = (float)((uint)bVar76 * auVar177._8_4_ | (uint)!bVar76 * auVar166._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        fVar129 = (float)((uint)bVar76 * auVar177._12_4_ | (uint)!bVar76 * auVar166._12_4_);
        auVar101 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar126,CONCAT44(fVar124,fVar80))));
        auVar107._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar167._0_4_
                    );
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar76 * auVar90._4_4_ | (uint)!bVar76 * auVar167._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar76 * auVar90._8_4_ | (uint)!bVar76 * auVar167._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar76 * auVar90._12_4_ | (uint)!bVar76 * auVar167._12_4_);
        fVar132 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar90._16_4_);
        auVar107._16_4_ = fVar132;
        fVar161 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar90._20_4_);
        auVar107._20_4_ = fVar161;
        fVar136 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar90._24_4_);
        auVar107._24_4_ = fVar136;
        iVar1 = (uint)(byte)(uVar72 >> 7) * auVar90._28_4_;
        auVar107._28_4_ = iVar1;
        auVar89 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar91);
        auVar108._0_4_ =
             (uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar10._0_4_;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar76 * auVar89._4_4_ | (uint)!bVar76 * auVar10._4_4_;
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar76 * auVar89._8_4_ | (uint)!bVar76 * auVar10._8_4_;
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar76 * auVar89._12_4_ | (uint)!bVar76 * auVar10._12_4_;
        auVar108._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar89._16_4_;
        auVar108._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar89._20_4_;
        auVar108._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar89._24_4_;
        auVar108._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar89._28_4_;
        auVar89 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar8));
        auVar109._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar177._0_4_
                    );
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar76 * auVar89._4_4_ | (uint)!bVar76 * auVar177._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar76 * auVar89._8_4_ | (uint)!bVar76 * auVar177._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar76 * auVar89._12_4_ | (uint)!bVar76 * auVar177._12_4_);
        fVar138 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar89._16_4_);
        auVar109._16_4_ = fVar138;
        fVar163 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar89._20_4_);
        auVar109._20_4_ = fVar163;
        fVar137 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar89._24_4_);
        auVar109._24_4_ = fVar137;
        auVar109._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar89._28_4_;
        auVar89 = vblendmps_avx512vl(auVar94,ZEXT1632(auVar9));
        auVar110._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar90._0_4_)
        ;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar76 * auVar89._4_4_ | (uint)!bVar76 * auVar90._4_4_);
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar76 * auVar89._8_4_ | (uint)!bVar76 * auVar90._8_4_);
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar76 * auVar89._12_4_ | (uint)!bVar76 * auVar90._12_4_);
        bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar76 * auVar89._16_4_ | (uint)!bVar76 * auVar90._16_4_);
        bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar76 * auVar89._20_4_ | (uint)!bVar76 * auVar90._20_4_);
        bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar76 * auVar89._24_4_ | (uint)!bVar76 * auVar90._24_4_);
        bVar76 = SUB81(uVar72 >> 7,0);
        auVar110._28_4_ = (uint)bVar76 * auVar89._28_4_ | (uint)!bVar76 * auVar90._28_4_;
        auVar111._0_4_ =
             (uint)(bVar70 & 1) * (int)auVar83._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar91._0_4_;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar76 * (int)auVar83._4_4_ | (uint)!bVar76 * auVar91._4_4_;
        bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar76 * (int)auVar83._8_4_ | (uint)!bVar76 * auVar91._8_4_;
        bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar76 * (int)auVar83._12_4_ | (uint)!bVar76 * auVar91._12_4_;
        auVar111._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar91._16_4_;
        auVar111._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar91._20_4_;
        auVar111._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar91._24_4_;
        auVar111._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar91._28_4_;
        bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar112._0_4_ =
             (uint)(bVar70 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar9._0_4_;
        bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar18 * auVar94._4_4_ | (uint)!bVar18 * auVar9._4_4_;
        bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar18 * auVar94._8_4_ | (uint)!bVar18 * auVar9._8_4_;
        bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar18 * auVar94._12_4_ | (uint)!bVar18 * auVar9._12_4_;
        auVar112._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar94._16_4_;
        auVar112._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar94._20_4_;
        auVar112._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar94._24_4_;
        iVar2 = (uint)(byte)(uVar72 >> 7) * auVar94._28_4_;
        auVar112._28_4_ = iVar2;
        auVar95 = vsubps_avx512vl(auVar111,auVar102);
        auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar84._12_4_ |
                                                (uint)!bVar21 * auVar8._12_4_,
                                                CONCAT48((uint)bVar19 * (int)auVar84._8_4_ |
                                                         (uint)!bVar19 * auVar8._8_4_,
                                                         CONCAT44((uint)bVar76 * (int)auVar84._4_4_
                                                                  | (uint)!bVar76 * auVar8._4_4_,
                                                                  (uint)(bVar70 & 1) *
                                                                  (int)auVar84._0_4_ |
                                                                  (uint)!(bool)(bVar70 & 1) *
                                                                  auVar8._0_4_)))),auVar101);
        auVar90 = vsubps_avx(auVar112,auVar107);
        auVar91 = vsubps_avx(auVar102,auVar108);
        auVar94 = vsubps_avx(auVar101,auVar109);
        auVar93 = vsubps_avx(auVar107,auVar110);
        auVar43._4_4_ = auVar90._4_4_ * fVar150;
        auVar43._0_4_ = auVar90._0_4_ * fVar79;
        auVar43._8_4_ = auVar90._8_4_ * fVar125;
        auVar43._12_4_ = auVar90._12_4_ * fVar128;
        auVar43._16_4_ = auVar90._16_4_ * 0.0;
        auVar43._20_4_ = auVar90._20_4_ * 0.0;
        auVar43._24_4_ = auVar90._24_4_ * 0.0;
        auVar43._28_4_ = iVar2;
        auVar81 = vfmsub231ps_fma(auVar43,auVar107,auVar95);
        auVar44._4_4_ = fVar124 * auVar95._4_4_;
        auVar44._0_4_ = fVar80 * auVar95._0_4_;
        auVar44._8_4_ = fVar126 * auVar95._8_4_;
        auVar44._12_4_ = fVar129 * auVar95._12_4_;
        auVar44._16_4_ = auVar95._16_4_ * 0.0;
        auVar44._20_4_ = auVar95._20_4_ * 0.0;
        auVar44._24_4_ = auVar95._24_4_ * 0.0;
        auVar44._28_4_ = auVar92._28_4_;
        auVar177 = vfmsub231ps_fma(auVar44,auVar102,auVar89);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar177),auVar98,ZEXT1632(auVar81));
        auVar155._0_4_ = auVar89._0_4_ * auVar107._0_4_;
        auVar155._4_4_ = auVar89._4_4_ * auVar107._4_4_;
        auVar155._8_4_ = auVar89._8_4_ * auVar107._8_4_;
        auVar155._12_4_ = auVar89._12_4_ * auVar107._12_4_;
        auVar155._16_4_ = auVar89._16_4_ * fVar132;
        auVar155._20_4_ = auVar89._20_4_ * fVar161;
        auVar155._24_4_ = auVar89._24_4_ * fVar136;
        auVar155._28_4_ = 0;
        auVar81 = vfmsub231ps_fma(auVar155,auVar101,auVar90);
        auVar96 = vfmadd231ps_avx512vl(auVar92,auVar98,ZEXT1632(auVar81));
        auVar92 = vmulps_avx512vl(auVar93,auVar108);
        auVar92 = vfmsub231ps_avx512vl(auVar92,auVar91,auVar110);
        auVar45._4_4_ = auVar94._4_4_ * auVar110._4_4_;
        auVar45._0_4_ = auVar94._0_4_ * auVar110._0_4_;
        auVar45._8_4_ = auVar94._8_4_ * auVar110._8_4_;
        auVar45._12_4_ = auVar94._12_4_ * auVar110._12_4_;
        auVar45._16_4_ = auVar94._16_4_ * auVar110._16_4_;
        auVar45._20_4_ = auVar94._20_4_ * auVar110._20_4_;
        auVar45._24_4_ = auVar94._24_4_ * auVar110._24_4_;
        auVar45._28_4_ = auVar110._28_4_;
        auVar81 = vfmsub231ps_fma(auVar45,auVar109,auVar93);
        auVar156._0_4_ = auVar109._0_4_ * auVar91._0_4_;
        auVar156._4_4_ = auVar109._4_4_ * auVar91._4_4_;
        auVar156._8_4_ = auVar109._8_4_ * auVar91._8_4_;
        auVar156._12_4_ = auVar109._12_4_ * auVar91._12_4_;
        auVar156._16_4_ = fVar138 * auVar91._16_4_;
        auVar156._20_4_ = fVar163 * auVar91._20_4_;
        auVar156._24_4_ = fVar137 * auVar91._24_4_;
        auVar156._28_4_ = 0;
        auVar177 = vfmsub231ps_fma(auVar156,auVar94,auVar108);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar177),auVar98,auVar92);
        auVar88 = vfmadd231ps_avx512vl(auVar92,auVar98,ZEXT1632(auVar81));
        auVar92 = vmaxps_avx(auVar96,auVar88);
        uVar139 = vcmpps_avx512vl(auVar92,auVar98,2);
        bVar78 = bVar78 & (byte)uVar139;
        auVar176 = ZEXT3264(local_340);
        auVar182 = ZEXT3264(local_360);
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar179 = ZEXT3264(auVar97);
        auVar185 = ZEXT3264(local_3e0);
        auVar181 = ZEXT3264(local_380);
        auVar187 = ZEXT3264(local_400);
        auVar183 = ZEXT3264(local_3a0);
        auVar186 = ZEXT3264(local_440);
        if (bVar78 != 0) {
          auVar46._4_4_ = auVar93._4_4_ * auVar89._4_4_;
          auVar46._0_4_ = auVar93._0_4_ * auVar89._0_4_;
          auVar46._8_4_ = auVar93._8_4_ * auVar89._8_4_;
          auVar46._12_4_ = auVar93._12_4_ * auVar89._12_4_;
          auVar46._16_4_ = auVar93._16_4_ * auVar89._16_4_;
          auVar46._20_4_ = auVar93._20_4_ * auVar89._20_4_;
          auVar46._24_4_ = auVar93._24_4_ * auVar89._24_4_;
          auVar46._28_4_ = auVar92._28_4_;
          auVar8 = vfmsub231ps_fma(auVar46,auVar94,auVar90);
          auVar47._4_4_ = auVar90._4_4_ * auVar91._4_4_;
          auVar47._0_4_ = auVar90._0_4_ * auVar91._0_4_;
          auVar47._8_4_ = auVar90._8_4_ * auVar91._8_4_;
          auVar47._12_4_ = auVar90._12_4_ * auVar91._12_4_;
          auVar47._16_4_ = auVar90._16_4_ * auVar91._16_4_;
          auVar47._20_4_ = auVar90._20_4_ * auVar91._20_4_;
          auVar47._24_4_ = auVar90._24_4_ * auVar91._24_4_;
          auVar47._28_4_ = auVar90._28_4_;
          auVar177 = vfmsub231ps_fma(auVar47,auVar95,auVar93);
          auVar48._4_4_ = auVar94._4_4_ * auVar95._4_4_;
          auVar48._0_4_ = auVar94._0_4_ * auVar95._0_4_;
          auVar48._8_4_ = auVar94._8_4_ * auVar95._8_4_;
          auVar48._12_4_ = auVar94._12_4_ * auVar95._12_4_;
          auVar48._16_4_ = auVar94._16_4_ * auVar95._16_4_;
          auVar48._20_4_ = auVar94._20_4_ * auVar95._20_4_;
          auVar48._24_4_ = auVar94._24_4_ * auVar95._24_4_;
          auVar48._28_4_ = auVar94._28_4_;
          auVar9 = vfmsub231ps_fma(auVar48,auVar91,auVar89);
          auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar177),ZEXT1632(auVar9));
          auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar8),auVar98);
          auVar92 = vrcp14ps_avx512vl(auVar89);
          auVar90 = vfnmadd213ps_avx512vl(auVar92,auVar89,auVar97);
          auVar81 = vfmadd132ps_fma(auVar90,auVar92,auVar92);
          auVar49._4_4_ = auVar9._4_4_ * auVar107._4_4_;
          auVar49._0_4_ = auVar9._0_4_ * auVar107._0_4_;
          auVar49._8_4_ = auVar9._8_4_ * auVar107._8_4_;
          auVar49._12_4_ = auVar9._12_4_ * auVar107._12_4_;
          auVar49._16_4_ = fVar132 * 0.0;
          auVar49._20_4_ = fVar161 * 0.0;
          auVar49._24_4_ = fVar136 * 0.0;
          auVar49._28_4_ = iVar1;
          auVar177 = vfmadd231ps_fma(auVar49,auVar101,ZEXT1632(auVar177));
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar102,ZEXT1632(auVar8));
          fVar132 = auVar81._0_4_;
          fVar136 = auVar81._4_4_;
          fVar137 = auVar81._8_4_;
          fVar138 = auVar81._12_4_;
          local_220 = ZEXT1632(CONCAT412(auVar177._12_4_ * fVar138,
                                         CONCAT48(auVar177._8_4_ * fVar137,
                                                  CONCAT44(auVar177._4_4_ * fVar136,
                                                           auVar177._0_4_ * fVar132))));
          auVar165._8_4_ = 3;
          auVar165._0_8_ = 0x300000003;
          auVar165._12_4_ = 3;
          auVar165._16_4_ = 3;
          auVar165._20_4_ = 3;
          auVar165._24_4_ = 3;
          auVar165._28_4_ = 3;
          auVar92 = vpermps_avx2(auVar165,ZEXT1632((undefined1  [16])aVar3));
          uVar139 = vcmpps_avx512vl(auVar92,local_220,2);
          fVar161 = ray->tfar;
          auVar27._4_4_ = fVar161;
          auVar27._0_4_ = fVar161;
          auVar27._8_4_ = fVar161;
          auVar27._12_4_ = fVar161;
          auVar27._16_4_ = fVar161;
          auVar27._20_4_ = fVar161;
          auVar27._24_4_ = fVar161;
          auVar27._28_4_ = fVar161;
          uVar24 = vcmpps_avx512vl(local_220,auVar27,2);
          bVar78 = (byte)uVar139 & (byte)uVar24 & bVar78;
          if (bVar78 != 0) {
            uVar139 = vcmpps_avx512vl(auVar89,auVar98,4);
            bVar78 = bVar78 & (byte)uVar139;
            if (bVar78 != 0) {
              fVar161 = auVar96._0_4_ * fVar132;
              fVar163 = auVar96._4_4_ * fVar136;
              auVar50._4_4_ = fVar163;
              auVar50._0_4_ = fVar161;
              fVar79 = auVar96._8_4_ * fVar137;
              auVar50._8_4_ = fVar79;
              fVar80 = auVar96._12_4_ * fVar138;
              auVar50._12_4_ = fVar80;
              fVar150 = auVar96._16_4_ * 0.0;
              auVar50._16_4_ = fVar150;
              fVar124 = auVar96._20_4_ * 0.0;
              auVar50._20_4_ = fVar124;
              fVar125 = auVar96._24_4_ * 0.0;
              auVar50._24_4_ = fVar125;
              auVar50._28_4_ = auVar89._28_4_;
              auVar92 = vsubps_avx512vl(auVar97,auVar50);
              local_260._0_4_ =
                   (float)((uint)(bVar70 & 1) * (int)fVar161 |
                          (uint)!(bool)(bVar70 & 1) * auVar92._0_4_);
              bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
              local_260._4_4_ = (float)((uint)bVar76 * (int)fVar163 | (uint)!bVar76 * auVar92._4_4_)
              ;
              bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
              local_260._8_4_ = (float)((uint)bVar76 * (int)fVar79 | (uint)!bVar76 * auVar92._8_4_);
              bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
              local_260._12_4_ =
                   (float)((uint)bVar76 * (int)fVar80 | (uint)!bVar76 * auVar92._12_4_);
              bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
              local_260._16_4_ =
                   (float)((uint)bVar76 * (int)fVar150 | (uint)!bVar76 * auVar92._16_4_);
              bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
              local_260._20_4_ =
                   (float)((uint)bVar76 * (int)fVar124 | (uint)!bVar76 * auVar92._20_4_);
              bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
              local_260._24_4_ =
                   (float)((uint)bVar76 * (int)fVar125 | (uint)!bVar76 * auVar92._24_4_);
              bVar76 = SUB81(uVar72 >> 7,0);
              local_260._28_4_ =
                   (float)((uint)bVar76 * auVar89._28_4_ | (uint)!bVar76 * auVar92._28_4_);
              auVar92 = vsubps_avx(ZEXT1632(auVar12),auVar87);
              auVar81 = vfmadd213ps_fma(auVar92,local_260,auVar87);
              fVar161 = pre->depth_scale;
              auVar28._4_4_ = fVar161;
              auVar28._0_4_ = fVar161;
              auVar28._8_4_ = fVar161;
              auVar28._12_4_ = fVar161;
              auVar28._16_4_ = fVar161;
              auVar28._20_4_ = fVar161;
              auVar28._24_4_ = fVar161;
              auVar28._28_4_ = fVar161;
              auVar92 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                           CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                    CONCAT44(auVar81._4_4_ +
                                                                             auVar81._4_4_,
                                                                             auVar81._0_4_ +
                                                                             auVar81._0_4_)))),
                                        auVar28);
              uVar139 = vcmpps_avx512vl(local_220,auVar92,6);
              if (((byte)uVar139 & bVar78) != 0) {
                auVar6._0_4_ = ray->tfar;
                auVar6._4_4_ = ray->mask;
                auVar6._8_4_ = ray->id;
                auVar6._12_4_ = ray->flags;
                uVar71 = vextractps_avx(auVar6,1);
                auVar153._0_4_ = auVar88._0_4_ * fVar132;
                auVar153._4_4_ = auVar88._4_4_ * fVar136;
                auVar153._8_4_ = auVar88._8_4_ * fVar137;
                auVar153._12_4_ = auVar88._12_4_ * fVar138;
                auVar153._16_4_ = auVar88._16_4_ * 0.0;
                auVar153._20_4_ = auVar88._20_4_ * 0.0;
                auVar153._24_4_ = auVar88._24_4_ * 0.0;
                auVar153._28_4_ = 0;
                auVar92 = vsubps_avx512vl(auVar97,auVar153);
                auVar113._0_4_ =
                     (uint)(bVar70 & 1) * (int)auVar153._0_4_ |
                     (uint)!(bool)(bVar70 & 1) * auVar92._0_4_;
                bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
                auVar113._4_4_ = (uint)bVar76 * (int)auVar153._4_4_ | (uint)!bVar76 * auVar92._4_4_;
                bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
                auVar113._8_4_ = (uint)bVar76 * (int)auVar153._8_4_ | (uint)!bVar76 * auVar92._8_4_;
                bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
                auVar113._12_4_ =
                     (uint)bVar76 * (int)auVar153._12_4_ | (uint)!bVar76 * auVar92._12_4_;
                bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
                auVar113._16_4_ =
                     (uint)bVar76 * (int)auVar153._16_4_ | (uint)!bVar76 * auVar92._16_4_;
                bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
                auVar113._20_4_ =
                     (uint)bVar76 * (int)auVar153._20_4_ | (uint)!bVar76 * auVar92._20_4_;
                bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
                auVar113._24_4_ =
                     (uint)bVar76 * (int)auVar153._24_4_ | (uint)!bVar76 * auVar92._24_4_;
                auVar113._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar92._28_4_;
                auVar29._8_4_ = 0x40000000;
                auVar29._0_8_ = 0x4000000040000000;
                auVar29._12_4_ = 0x40000000;
                auVar29._16_4_ = 0x40000000;
                auVar29._20_4_ = 0x40000000;
                auVar29._24_4_ = 0x40000000;
                auVar29._28_4_ = 0x40000000;
                local_240 = vfmsub132ps_avx512vl(auVar113,auVar97,auVar29);
                local_200 = 0;
                local_1fc = iVar15;
                local_1f0 = local_470;
                local_1e0 = local_480._0_8_;
                uStack_1d8 = local_480._8_8_;
                local_1d0 = local_490._0_8_;
                uStack_1c8 = local_490._8_8_;
                if ((pGVar16->mask & uVar71) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar76 = true, local_490 = auVar13, local_480 = auVar140,
                     pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar161 = 1.0 / auVar170._0_4_;
                    local_1a0[0] = fVar161 * (local_260._0_4_ + 0.0);
                    local_1a0[1] = fVar161 * (local_260._4_4_ + 1.0);
                    local_1a0[2] = fVar161 * (local_260._8_4_ + 2.0);
                    local_1a0[3] = fVar161 * (local_260._12_4_ + 3.0);
                    fStack_190 = fVar161 * (local_260._16_4_ + 4.0);
                    fStack_18c = fVar161 * (local_260._20_4_ + 5.0);
                    fStack_188 = fVar161 * (local_260._24_4_ + 6.0);
                    fStack_184 = local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    lVar75 = 0;
                    uVar74 = (ulong)((byte)uVar139 & bVar78);
                    for (uVar72 = uVar74; (uVar72 & 1) == 0;
                        uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                      lVar75 = lVar75 + 1;
                    }
                    local_520 = auVar82;
                    local_4a0 = auVar6;
                    local_490 = auVar13;
                    local_480 = auVar140;
                    do {
                      auVar177 = auVar178._0_16_;
                      local_2c0._0_8_ = uVar74;
                      local_4d4 = local_1a0[lVar75];
                      local_4d0 = *(undefined4 *)(local_180 + lVar75 * 4);
                      local_2a0._0_8_ = lVar75;
                      local_548->tfar = *(float *)(local_160 + lVar75 * 4);
                      local_510.context = context->user;
                      fVar132 = 1.0 - local_4d4;
                      fVar161 = fVar132 * fVar132 * -3.0;
                      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132)),
                                                ZEXT416((uint)(local_4d4 * fVar132)),
                                                ZEXT416(0xc0000000));
                      auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_4d4 * fVar132)),
                                                ZEXT416((uint)(local_4d4 * local_4d4)),
                                                ZEXT416(0x40000000));
                      fVar132 = auVar82._0_4_ * 3.0;
                      fVar136 = auVar81._0_4_ * 3.0;
                      fVar137 = local_4d4 * local_4d4 * 3.0;
                      auVar159._0_4_ = fVar137 * (float)local_310._0_4_;
                      auVar159._4_4_ = fVar137 * (float)local_310._4_4_;
                      auVar159._8_4_ = fVar137 * fStack_308;
                      auVar159._12_4_ = fVar137 * fStack_304;
                      auVar144._4_4_ = fVar136;
                      auVar144._0_4_ = fVar136;
                      auVar144._8_4_ = fVar136;
                      auVar144._12_4_ = fVar136;
                      auVar82 = vfmadd132ps_fma(auVar144,auVar159,local_490);
                      auVar151._4_4_ = fVar132;
                      auVar151._0_4_ = fVar132;
                      auVar151._8_4_ = fVar132;
                      auVar151._12_4_ = fVar132;
                      auVar82 = vfmadd132ps_fma(auVar151,auVar82,local_480);
                      auVar145._4_4_ = fVar161;
                      auVar145._0_4_ = fVar161;
                      auVar145._8_4_ = fVar161;
                      auVar145._12_4_ = fVar161;
                      auVar82 = vfmadd213ps_fma(auVar145,local_470,auVar82);
                      local_4e0 = vmovlps_avx(auVar82);
                      local_4d8 = vextractps_avx(auVar82,2);
                      local_4cc = local_52c;
                      local_4c8 = (int)local_528;
                      local_4c4 = (local_510.context)->instID[0];
                      local_4c0 = (local_510.context)->instPrimID[0];
                      local_54c = -1;
                      local_510.valid = &local_54c;
                      local_510.geometryUserPtr = pGVar16->userPtr;
                      local_510.ray = (RTCRayN *)local_548;
                      local_510.hit = (RTCHitN *)&local_4e0;
                      local_510.N = 1;
                      if ((pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar16->occlusionFilterN)(&local_510), *local_510.valid != 0)) {
                        p_Var17 = context->args->filter;
                        if ((p_Var17 == (RTCFilterFunctionN)0x0) ||
                           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((pGVar16->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*p_Var17)(&local_510), *local_510.valid != 0)))) {
                          bVar76 = true;
                          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar179 = ZEXT3264(auVar92);
                          auVar82 = vxorps_avx512vl(auVar177,auVar177);
                          auVar178 = ZEXT1664(auVar82);
                          auVar176 = ZEXT3264(local_340);
                          auVar182 = ZEXT3264(local_360);
                          auVar185 = ZEXT3264(local_3e0);
                          auVar181 = ZEXT3264(local_380);
                          auVar187 = ZEXT3264(local_400);
                          auVar184 = ZEXT3264(local_420);
                          auVar183 = ZEXT3264(local_3a0);
                          auVar186 = ZEXT3264(local_440);
                          auVar180 = ZEXT3264(local_3c0);
                          pre = local_538;
                          auVar82 = local_520;
                          break;
                        }
                      }
                      local_548->tfar = (float)local_4a0._0_4_;
                      bVar76 = false;
                      lVar75 = 0;
                      uVar74 = local_2c0._0_8_ ^ 1L << (local_2a0._0_8_ & 0x3f);
                      for (uVar72 = uVar74; (uVar72 & 1) == 0;
                          uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                        lVar75 = lVar75 + 1;
                      }
                      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar179 = ZEXT3264(auVar92);
                      auVar82 = vxorps_avx512vl(auVar177,auVar177);
                      auVar178 = ZEXT1664(auVar82);
                      auVar176 = ZEXT3264(local_340);
                      auVar182 = ZEXT3264(local_360);
                      auVar185 = ZEXT3264(local_3e0);
                      auVar181 = ZEXT3264(local_380);
                      auVar187 = ZEXT3264(local_400);
                      auVar184 = ZEXT3264(local_420);
                      auVar183 = ZEXT3264(local_3a0);
                      auVar186 = ZEXT3264(local_440);
                      auVar180 = ZEXT3264(local_3c0);
                      pre = local_538;
                      auVar82 = local_520;
                    } while (uVar74 != 0);
                  }
                  goto LAB_01c81f5e;
                }
              }
            }
          }
        }
        bVar76 = false;
        local_490 = auVar13;
        local_480 = auVar140;
      }
LAB_01c81f5e:
      if (8 < iVar15) {
        local_2a0 = vpbroadcastd_avx512vl();
        local_2c0 = vbroadcastss_avx512vl(auVar82);
        auVar135._8_4_ = 3;
        auVar135._0_8_ = 0x300000003;
        auVar135._12_4_ = 3;
        auVar135._16_4_ = 3;
        auVar135._20_4_ = 3;
        auVar135._24_4_ = 3;
        auVar135._28_4_ = 3;
        local_2e0 = vpermps_avx2(auVar135,local_2e0);
        local_300._4_4_ = 1.0 / (float)local_300._0_4_;
        local_300._0_4_ = local_300._4_4_;
        fStack_2f8 = (float)local_300._4_4_;
        fStack_2f4 = (float)local_300._4_4_;
        fStack_2f0 = (float)local_300._4_4_;
        fStack_2ec = (float)local_300._4_4_;
        fStack_2e8 = (float)local_300._4_4_;
        fStack_2e4 = (float)local_300._4_4_;
        lVar75 = 8;
        do {
          auVar92 = vpbroadcastd_avx512vl();
          auVar94 = vpor_avx2(auVar92,_DAT_01fe9900);
          uVar24 = vpcmpd_avx512vl(auVar94,local_2a0,1);
          auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 * 4 + lVar25);
          auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21aa768 + lVar75 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21aabec + lVar75 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21ab070 + lVar75 * 4);
          local_3a0 = auVar183._0_32_;
          auVar93 = vmulps_avx512vl(local_3a0,auVar91);
          auVar148 = auVar186._0_32_;
          auVar102 = vmulps_avx512vl(auVar148,auVar91);
          auVar51._4_4_ = auVar91._4_4_ * (float)local_100._4_4_;
          auVar51._0_4_ = auVar91._0_4_ * (float)local_100._0_4_;
          auVar51._8_4_ = auVar91._8_4_ * fStack_f8;
          auVar51._12_4_ = auVar91._12_4_ * fStack_f4;
          auVar51._16_4_ = auVar91._16_4_ * fStack_f0;
          auVar51._20_4_ = auVar91._20_4_ * fStack_ec;
          auVar51._24_4_ = auVar91._24_4_ * fStack_e8;
          auVar51._28_4_ = auVar94._28_4_;
          auVar162 = auVar187._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar162);
          auVar100 = auVar184._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar100);
          auVar102 = vfmadd231ps_avx512vl(auVar51,auVar90,local_e0);
          auVar142 = auVar185._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar142);
          local_380 = auVar181._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_380);
          auVar82 = vfmadd231ps_fma(auVar102,auVar89,local_c0);
          local_340 = auVar176._0_32_;
          auVar81 = vfmadd231ps_fma(auVar94,auVar92,local_340);
          local_360 = auVar182._0_32_;
          auVar88 = vfmadd231ps_avx512vl(auVar93,auVar92,local_360);
          auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 * 4 + lVar25);
          auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21acb88 + lVar75 * 4);
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar92,local_a0);
          auVar102 = *(undefined1 (*) [32])(lVar25 + 0x21ad00c + lVar75 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar25 + 0x21ad490 + lVar75 * 4);
          auVar95 = vmulps_avx512vl(local_3a0,auVar101);
          auVar96 = vmulps_avx512vl(auVar148,auVar101);
          auVar52._4_4_ = auVar101._4_4_ * (float)local_100._4_4_;
          auVar52._0_4_ = auVar101._0_4_ * (float)local_100._0_4_;
          auVar52._8_4_ = auVar101._8_4_ * fStack_f8;
          auVar52._12_4_ = auVar101._12_4_ * fStack_f4;
          auVar52._16_4_ = auVar101._16_4_ * fStack_f0;
          auVar52._20_4_ = auVar101._20_4_ * fStack_ec;
          auVar52._24_4_ = auVar101._24_4_ * fStack_e8;
          auVar52._28_4_ = uStack_e4;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar162);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar100);
          auVar97 = vfmadd231ps_avx512vl(auVar52,auVar102,local_e0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar142);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_380);
          auVar177 = vfmadd231ps_fma(auVar97,auVar93,local_c0);
          auVar97 = vfmadd231ps_avx512vl(auVar95,auVar94,local_340);
          auVar98 = vfmadd231ps_avx512vl(auVar96,auVar94,local_360);
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar94,local_a0);
          auVar86 = vmaxps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar177));
          auVar95 = vsubps_avx(auVar97,ZEXT1632(auVar81));
          auVar96 = vsubps_avx(auVar98,auVar88);
          auVar87 = vmulps_avx512vl(auVar88,auVar95);
          auVar99 = vmulps_avx512vl(ZEXT1632(auVar81),auVar96);
          auVar87 = vsubps_avx512vl(auVar87,auVar99);
          auVar99 = vmulps_avx512vl(auVar96,auVar96);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,auVar95);
          auVar86 = vmulps_avx512vl(auVar86,auVar86);
          auVar86 = vmulps_avx512vl(auVar86,auVar99);
          auVar87 = vmulps_avx512vl(auVar87,auVar87);
          uVar139 = vcmpps_avx512vl(auVar87,auVar86,2);
          bVar78 = (byte)uVar24 & (byte)uVar139;
          if (bVar78 == 0) {
            auVar176 = ZEXT3264(local_340);
          }
          else {
            local_3c0 = auVar180._0_32_;
            auVar101 = vmulps_avx512vl(local_460,auVar101);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_140,auVar101);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_120,auVar102);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_3c0,auVar93);
            auVar91 = vmulps_avx512vl(local_460,auVar91);
            auVar90 = vfmadd213ps_avx512vl(auVar90,local_140,auVar91);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_120,auVar90);
            auVar93 = vfmadd213ps_avx512vl(auVar92,local_3c0,auVar89);
            auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21ab4f4 + lVar75 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21ab978 + lVar75 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21abdfc + lVar75 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21ac280 + lVar75 * 4);
            auVar102 = vmulps_avx512vl(local_3a0,auVar91);
            auVar101 = vmulps_avx512vl(auVar148,auVar91);
            auVar91 = vmulps_avx512vl(local_460,auVar91);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar162);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar90,auVar100);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
            auVar91 = vfmadd231ps_avx512vl(auVar102,auVar89,auVar142);
            auVar102 = vfmadd231ps_avx512vl(auVar101,auVar89,local_380);
            auVar89 = vfmadd231ps_avx512vl(auVar90,local_120,auVar89);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar92,local_340);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar92,local_360);
            auVar101 = vfmadd231ps_avx512vl(auVar89,local_3c0,auVar92);
            auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21ad914 + lVar75 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21ae21c + lVar75 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21ae6a0 + lVar75 * 4);
            auVar86 = vmulps_avx512vl(local_3a0,auVar90);
            auVar87 = vmulps_avx512vl(auVar148,auVar90);
            auVar90 = vmulps_avx512vl(local_460,auVar90);
            auVar180 = ZEXT3264(local_3c0);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar89,auVar162);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar100);
            auVar90 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21add98 + lVar75 * 4);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar89,auVar142);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,local_380);
            auVar89 = vfmadd231ps_avx512vl(auVar90,local_120,auVar89);
            auVar90 = vfmadd231ps_avx512vl(auVar86,auVar92,local_340);
            auVar86 = vfmadd231ps_avx512vl(auVar87,auVar92,local_360);
            auVar89 = vfmadd231ps_avx512vl(auVar89,local_3c0,auVar92);
            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar91,auVar87);
            vandps_avx512vl(auVar102,auVar87);
            auVar92 = vmaxps_avx(auVar87,auVar87);
            vandps_avx512vl(auVar101,auVar87);
            auVar92 = vmaxps_avx(auVar92,auVar87);
            uVar72 = vcmpps_avx512vl(auVar92,local_2c0,1);
            bVar18 = (bool)((byte)uVar72 & 1);
            auVar114._0_4_ = (float)((uint)bVar18 * auVar95._0_4_ | (uint)!bVar18 * auVar91._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar18 * auVar95._4_4_ | (uint)!bVar18 * auVar91._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar18 * auVar95._8_4_ | (uint)!bVar18 * auVar91._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar18 * auVar95._12_4_ | (uint)!bVar18 * auVar91._12_4_);
            bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar114._16_4_ =
                 (float)((uint)bVar18 * auVar95._16_4_ | (uint)!bVar18 * auVar91._16_4_);
            bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar114._20_4_ =
                 (float)((uint)bVar18 * auVar95._20_4_ | (uint)!bVar18 * auVar91._20_4_);
            bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar114._24_4_ =
                 (float)((uint)bVar18 * auVar95._24_4_ | (uint)!bVar18 * auVar91._24_4_);
            bVar18 = SUB81(uVar72 >> 7,0);
            auVar114._28_4_ = (uint)bVar18 * auVar95._28_4_ | (uint)!bVar18 * auVar91._28_4_;
            bVar18 = (bool)((byte)uVar72 & 1);
            auVar115._0_4_ = (float)((uint)bVar18 * auVar96._0_4_ | (uint)!bVar18 * auVar102._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar18 * auVar96._4_4_ | (uint)!bVar18 * auVar102._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar18 * auVar96._8_4_ | (uint)!bVar18 * auVar102._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar18 * auVar96._12_4_ | (uint)!bVar18 * auVar102._12_4_);
            bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar115._16_4_ =
                 (float)((uint)bVar18 * auVar96._16_4_ | (uint)!bVar18 * auVar102._16_4_);
            bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar115._20_4_ =
                 (float)((uint)bVar18 * auVar96._20_4_ | (uint)!bVar18 * auVar102._20_4_);
            bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar115._24_4_ =
                 (float)((uint)bVar18 * auVar96._24_4_ | (uint)!bVar18 * auVar102._24_4_);
            bVar18 = SUB81(uVar72 >> 7,0);
            auVar115._28_4_ = (uint)bVar18 * auVar96._28_4_ | (uint)!bVar18 * auVar102._28_4_;
            vandps_avx512vl(auVar90,auVar87);
            vandps_avx512vl(auVar86,auVar87);
            auVar92 = vmaxps_avx(auVar115,auVar115);
            vandps_avx512vl(auVar89,auVar87);
            auVar92 = vmaxps_avx(auVar92,auVar115);
            uVar72 = vcmpps_avx512vl(auVar92,local_2c0,1);
            bVar18 = (bool)((byte)uVar72 & 1);
            auVar116._0_4_ = (uint)bVar18 * auVar95._0_4_ | (uint)!bVar18 * auVar90._0_4_;
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar116._4_4_ = (uint)bVar18 * auVar95._4_4_ | (uint)!bVar18 * auVar90._4_4_;
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar116._8_4_ = (uint)bVar18 * auVar95._8_4_ | (uint)!bVar18 * auVar90._8_4_;
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar116._12_4_ = (uint)bVar18 * auVar95._12_4_ | (uint)!bVar18 * auVar90._12_4_;
            bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar116._16_4_ = (uint)bVar18 * auVar95._16_4_ | (uint)!bVar18 * auVar90._16_4_;
            bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar116._20_4_ = (uint)bVar18 * auVar95._20_4_ | (uint)!bVar18 * auVar90._20_4_;
            bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar116._24_4_ = (uint)bVar18 * auVar95._24_4_ | (uint)!bVar18 * auVar90._24_4_;
            bVar18 = SUB81(uVar72 >> 7,0);
            auVar116._28_4_ = (uint)bVar18 * auVar95._28_4_ | (uint)!bVar18 * auVar90._28_4_;
            bVar18 = (bool)((byte)uVar72 & 1);
            auVar117._0_4_ = (float)((uint)bVar18 * auVar96._0_4_ | (uint)!bVar18 * auVar86._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar18 * auVar96._4_4_ | (uint)!bVar18 * auVar86._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar18 * auVar96._8_4_ | (uint)!bVar18 * auVar86._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar18 * auVar96._12_4_ | (uint)!bVar18 * auVar86._12_4_);
            bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar18 * auVar96._16_4_ | (uint)!bVar18 * auVar86._16_4_);
            bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar18 * auVar96._20_4_ | (uint)!bVar18 * auVar86._20_4_);
            bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar18 * auVar96._24_4_ | (uint)!bVar18 * auVar86._24_4_);
            bVar18 = SUB81(uVar72 >> 7,0);
            auVar117._28_4_ = (uint)bVar18 * auVar96._28_4_ | (uint)!bVar18 * auVar86._28_4_;
            auVar168._8_4_ = 0x80000000;
            auVar168._0_8_ = 0x8000000080000000;
            auVar168._12_4_ = 0x80000000;
            auVar168._16_4_ = 0x80000000;
            auVar168._20_4_ = 0x80000000;
            auVar168._24_4_ = 0x80000000;
            auVar168._28_4_ = 0x80000000;
            auVar92 = vxorps_avx512vl(auVar116,auVar168);
            auVar99 = auVar178._0_32_;
            auVar89 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar99);
            auVar8 = vfmadd231ps_fma(auVar89,auVar115,auVar115);
            auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar8));
            auVar175._8_4_ = 0xbf000000;
            auVar175._0_8_ = 0xbf000000bf000000;
            auVar175._12_4_ = 0xbf000000;
            auVar175._16_4_ = 0xbf000000;
            auVar175._20_4_ = 0xbf000000;
            auVar175._24_4_ = 0xbf000000;
            auVar175._28_4_ = 0xbf000000;
            fVar161 = auVar89._0_4_;
            fVar132 = auVar89._4_4_;
            fVar136 = auVar89._8_4_;
            fVar137 = auVar89._12_4_;
            fVar138 = auVar89._16_4_;
            fVar163 = auVar89._20_4_;
            fVar79 = auVar89._24_4_;
            auVar53._4_4_ = fVar132 * fVar132 * fVar132 * auVar8._4_4_ * -0.5;
            auVar53._0_4_ = fVar161 * fVar161 * fVar161 * auVar8._0_4_ * -0.5;
            auVar53._8_4_ = fVar136 * fVar136 * fVar136 * auVar8._8_4_ * -0.5;
            auVar53._12_4_ = fVar137 * fVar137 * fVar137 * auVar8._12_4_ * -0.5;
            auVar53._16_4_ = fVar138 * fVar138 * fVar138 * -0.0;
            auVar53._20_4_ = fVar163 * fVar163 * fVar163 * -0.0;
            auVar53._24_4_ = fVar79 * fVar79 * fVar79 * -0.0;
            auVar53._28_4_ = auVar115._28_4_;
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar89 = vfmadd231ps_avx512vl(auVar53,auVar90,auVar89);
            auVar54._4_4_ = auVar115._4_4_ * auVar89._4_4_;
            auVar54._0_4_ = auVar115._0_4_ * auVar89._0_4_;
            auVar54._8_4_ = auVar115._8_4_ * auVar89._8_4_;
            auVar54._12_4_ = auVar115._12_4_ * auVar89._12_4_;
            auVar54._16_4_ = auVar115._16_4_ * auVar89._16_4_;
            auVar54._20_4_ = auVar115._20_4_ * auVar89._20_4_;
            auVar54._24_4_ = auVar115._24_4_ * auVar89._24_4_;
            auVar54._28_4_ = 0;
            auVar55._4_4_ = auVar89._4_4_ * -auVar114._4_4_;
            auVar55._0_4_ = auVar89._0_4_ * -auVar114._0_4_;
            auVar55._8_4_ = auVar89._8_4_ * -auVar114._8_4_;
            auVar55._12_4_ = auVar89._12_4_ * -auVar114._12_4_;
            auVar55._16_4_ = auVar89._16_4_ * -auVar114._16_4_;
            auVar55._20_4_ = auVar89._20_4_ * -auVar114._20_4_;
            auVar55._24_4_ = auVar89._24_4_ * -auVar114._24_4_;
            auVar55._28_4_ = auVar115._28_4_;
            auVar91 = vmulps_avx512vl(auVar89,auVar99);
            auVar89 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar99);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar117,auVar117);
            auVar102 = vrsqrt14ps_avx512vl(auVar89);
            auVar89 = vmulps_avx512vl(auVar89,auVar175);
            fVar161 = auVar102._0_4_;
            fVar132 = auVar102._4_4_;
            fVar136 = auVar102._8_4_;
            fVar137 = auVar102._12_4_;
            fVar138 = auVar102._16_4_;
            fVar163 = auVar102._20_4_;
            fVar79 = auVar102._24_4_;
            auVar56._4_4_ = fVar132 * fVar132 * fVar132 * auVar89._4_4_;
            auVar56._0_4_ = fVar161 * fVar161 * fVar161 * auVar89._0_4_;
            auVar56._8_4_ = fVar136 * fVar136 * fVar136 * auVar89._8_4_;
            auVar56._12_4_ = fVar137 * fVar137 * fVar137 * auVar89._12_4_;
            auVar56._16_4_ = fVar138 * fVar138 * fVar138 * auVar89._16_4_;
            auVar56._20_4_ = fVar163 * fVar163 * fVar163 * auVar89._20_4_;
            auVar56._24_4_ = fVar79 * fVar79 * fVar79 * auVar89._24_4_;
            auVar56._28_4_ = auVar89._28_4_;
            auVar89 = vfmadd231ps_avx512vl(auVar56,auVar90,auVar102);
            auVar57._4_4_ = auVar117._4_4_ * auVar89._4_4_;
            auVar57._0_4_ = auVar117._0_4_ * auVar89._0_4_;
            auVar57._8_4_ = auVar117._8_4_ * auVar89._8_4_;
            auVar57._12_4_ = auVar117._12_4_ * auVar89._12_4_;
            auVar57._16_4_ = auVar117._16_4_ * auVar89._16_4_;
            auVar57._20_4_ = auVar117._20_4_ * auVar89._20_4_;
            auVar57._24_4_ = auVar117._24_4_ * auVar89._24_4_;
            auVar57._28_4_ = auVar102._28_4_;
            auVar58._4_4_ = auVar89._4_4_ * auVar92._4_4_;
            auVar58._0_4_ = auVar89._0_4_ * auVar92._0_4_;
            auVar58._8_4_ = auVar89._8_4_ * auVar92._8_4_;
            auVar58._12_4_ = auVar89._12_4_ * auVar92._12_4_;
            auVar58._16_4_ = auVar89._16_4_ * auVar92._16_4_;
            auVar58._20_4_ = auVar89._20_4_ * auVar92._20_4_;
            auVar58._24_4_ = auVar89._24_4_ * auVar92._24_4_;
            auVar58._28_4_ = auVar92._28_4_;
            auVar92 = vmulps_avx512vl(auVar89,auVar99);
            auVar8 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar82),ZEXT1632(auVar81));
            auVar89 = ZEXT1632(auVar82);
            auVar9 = vfmadd213ps_fma(auVar55,auVar89,auVar88);
            auVar90 = vfmadd213ps_avx512vl(auVar91,auVar89,auVar93);
            auVar102 = vfmadd213ps_avx512vl(auVar57,ZEXT1632(auVar177),auVar97);
            auVar13 = vfnmadd213ps_fma(auVar54,auVar89,ZEXT1632(auVar81));
            auVar101 = ZEXT1632(auVar177);
            auVar81 = vfmadd213ps_fma(auVar58,auVar101,auVar98);
            auVar140 = vfnmadd213ps_fma(auVar55,auVar89,auVar88);
            auVar10 = vfmadd213ps_fma(auVar92,auVar101,auVar94);
            auVar86 = ZEXT1632(auVar82);
            auVar141 = vfnmadd231ps_fma(auVar93,auVar86,auVar91);
            auVar83 = vfnmadd213ps_fma(auVar57,auVar101,auVar97);
            auVar84 = vfnmadd213ps_fma(auVar58,auVar101,auVar98);
            auVar166 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar177),auVar92);
            auVar94 = vsubps_avx512vl(auVar102,ZEXT1632(auVar13));
            auVar92 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar140));
            auVar89 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar141));
            auVar59._4_4_ = auVar92._4_4_ * auVar141._4_4_;
            auVar59._0_4_ = auVar92._0_4_ * auVar141._0_4_;
            auVar59._8_4_ = auVar92._8_4_ * auVar141._8_4_;
            auVar59._12_4_ = auVar92._12_4_ * auVar141._12_4_;
            auVar59._16_4_ = auVar92._16_4_ * 0.0;
            auVar59._20_4_ = auVar92._20_4_ * 0.0;
            auVar59._24_4_ = auVar92._24_4_ * 0.0;
            auVar59._28_4_ = auVar91._28_4_;
            auVar82 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar140),auVar89);
            auVar60._4_4_ = auVar89._4_4_ * auVar13._4_4_;
            auVar60._0_4_ = auVar89._0_4_ * auVar13._0_4_;
            auVar60._8_4_ = auVar89._8_4_ * auVar13._8_4_;
            auVar60._12_4_ = auVar89._12_4_ * auVar13._12_4_;
            auVar60._16_4_ = auVar89._16_4_ * 0.0;
            auVar60._20_4_ = auVar89._20_4_ * 0.0;
            auVar60._24_4_ = auVar89._24_4_ * 0.0;
            auVar60._28_4_ = auVar89._28_4_;
            auVar11 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar141),auVar94);
            auVar61._4_4_ = auVar140._4_4_ * auVar94._4_4_;
            auVar61._0_4_ = auVar140._0_4_ * auVar94._0_4_;
            auVar61._8_4_ = auVar140._8_4_ * auVar94._8_4_;
            auVar61._12_4_ = auVar140._12_4_ * auVar94._12_4_;
            auVar61._16_4_ = auVar94._16_4_ * 0.0;
            auVar61._20_4_ = auVar94._20_4_ * 0.0;
            auVar61._24_4_ = auVar94._24_4_ * 0.0;
            auVar61._28_4_ = auVar94._28_4_;
            auVar12 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar13),auVar92);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar12),auVar99,ZEXT1632(auVar11));
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,ZEXT1632(auVar82));
            uVar72 = vcmpps_avx512vl(auVar92,auVar99,2);
            bVar70 = (byte)uVar72;
            fVar124 = (float)((uint)(bVar70 & 1) * auVar8._0_4_ |
                             (uint)!(bool)(bVar70 & 1) * auVar83._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            fVar126 = (float)((uint)bVar18 * auVar8._4_4_ | (uint)!bVar18 * auVar83._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            fVar129 = (float)((uint)bVar18 * auVar8._8_4_ | (uint)!bVar18 * auVar83._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            fVar130 = (float)((uint)bVar18 * auVar8._12_4_ | (uint)!bVar18 * auVar83._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar129,CONCAT44(fVar126,fVar124))));
            fVar125 = (float)((uint)(bVar70 & 1) * auVar9._0_4_ |
                             (uint)!(bool)(bVar70 & 1) * auVar84._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            fVar128 = (float)((uint)bVar18 * auVar9._4_4_ | (uint)!bVar18 * auVar84._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            fVar127 = (float)((uint)bVar18 * auVar9._8_4_ | (uint)!bVar18 * auVar84._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            fVar131 = (float)((uint)bVar18 * auVar9._12_4_ | (uint)!bVar18 * auVar84._12_4_);
            auVar95 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar127,CONCAT44(fVar128,fVar125))));
            auVar118._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar166._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar18 * auVar90._4_4_ | (uint)!bVar18 * auVar166._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar18 * auVar90._8_4_ | (uint)!bVar18 * auVar166._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar18 * auVar90._12_4_ | (uint)!bVar18 * auVar166._12_4_);
            fVar161 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar90._16_4_);
            auVar118._16_4_ = fVar161;
            fVar132 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar90._20_4_);
            auVar118._20_4_ = fVar132;
            fVar136 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar90._24_4_);
            auVar118._24_4_ = fVar136;
            iVar1 = (uint)(byte)(uVar72 >> 7) * auVar90._28_4_;
            auVar118._28_4_ = iVar1;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar13),auVar102);
            auVar119._0_4_ =
                 (uint)(bVar70 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar82._0_4_;
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar18 * auVar92._4_4_ | (uint)!bVar18 * auVar82._4_4_;
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar18 * auVar92._8_4_ | (uint)!bVar18 * auVar82._8_4_;
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar18 * auVar92._12_4_ | (uint)!bVar18 * auVar82._12_4_;
            auVar119._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar92._16_4_;
            auVar119._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar92._20_4_;
            auVar119._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar92._24_4_;
            auVar119._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar92._28_4_;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar140),ZEXT1632(auVar81));
            auVar120._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar8._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar18 * auVar92._4_4_ | (uint)!bVar18 * auVar8._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar18 * auVar92._8_4_ | (uint)!bVar18 * auVar8._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar120._12_4_ = (float)((uint)bVar18 * auVar92._12_4_ | (uint)!bVar18 * auVar8._12_4_)
            ;
            fVar137 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar92._16_4_);
            auVar120._16_4_ = fVar137;
            fVar138 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar92._20_4_);
            auVar120._20_4_ = fVar138;
            fVar163 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar92._24_4_);
            auVar120._24_4_ = fVar163;
            auVar120._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar92._28_4_;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar141),ZEXT1632(auVar10));
            auVar121._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar9._0_4_);
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar18 * auVar92._4_4_ | (uint)!bVar18 * auVar9._4_4_);
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar18 * auVar92._8_4_ | (uint)!bVar18 * auVar9._8_4_);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar121._12_4_ = (float)((uint)bVar18 * auVar92._12_4_ | (uint)!bVar18 * auVar9._12_4_)
            ;
            fVar150 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar92._16_4_);
            auVar121._16_4_ = fVar150;
            fVar80 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar92._20_4_);
            auVar121._20_4_ = fVar80;
            fVar79 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar92._24_4_);
            auVar121._24_4_ = fVar79;
            iVar2 = (uint)(byte)(uVar72 >> 7) * auVar92._28_4_;
            auVar121._28_4_ = iVar2;
            auVar122._0_4_ =
                 (uint)(bVar70 & 1) * (int)auVar13._0_4_ |
                 (uint)!(bool)(bVar70 & 1) * auVar102._0_4_;
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar122._4_4_ = (uint)bVar18 * (int)auVar13._4_4_ | (uint)!bVar18 * auVar102._4_4_;
            bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar122._8_4_ = (uint)bVar18 * (int)auVar13._8_4_ | (uint)!bVar18 * auVar102._8_4_;
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar122._12_4_ = (uint)bVar18 * (int)auVar13._12_4_ | (uint)!bVar18 * auVar102._12_4_;
            auVar122._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar102._16_4_;
            auVar122._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar102._20_4_;
            auVar122._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar102._24_4_;
            auVar122._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar102._28_4_;
            bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
            bVar21 = (bool)((byte)(uVar72 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar72 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar72 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar102 = vsubps_avx512vl(auVar122,auVar101);
            auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar140._12_4_ |
                                                    (uint)!bVar22 * auVar81._12_4_,
                                                    CONCAT48((uint)bVar21 * (int)auVar140._8_4_ |
                                                             (uint)!bVar21 * auVar81._8_4_,
                                                             CONCAT44((uint)bVar18 *
                                                                      (int)auVar140._4_4_ |
                                                                      (uint)!bVar18 * auVar81._4_4_,
                                                                      (uint)(bVar70 & 1) *
                                                                      (int)auVar140._0_4_ |
                                                                      (uint)!(bool)(bVar70 & 1) *
                                                                      auVar81._0_4_)))),auVar95);
            auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar141._12_4_ |
                                                    (uint)!bVar23 * auVar10._12_4_,
                                                    CONCAT48((uint)bVar20 * (int)auVar141._8_4_ |
                                                             (uint)!bVar20 * auVar10._8_4_,
                                                             CONCAT44((uint)bVar19 *
                                                                      (int)auVar141._4_4_ |
                                                                      (uint)!bVar19 * auVar10._4_4_,
                                                                      (uint)(bVar70 & 1) *
                                                                      (int)auVar141._0_4_ |
                                                                      (uint)!(bool)(bVar70 & 1) *
                                                                      auVar10._0_4_)))),auVar118);
            auVar91 = vsubps_avx(auVar101,auVar119);
            auVar94 = vsubps_avx(auVar95,auVar120);
            auVar93 = vsubps_avx(auVar118,auVar121);
            auVar62._4_4_ = auVar90._4_4_ * fVar126;
            auVar62._0_4_ = auVar90._0_4_ * fVar124;
            auVar62._8_4_ = auVar90._8_4_ * fVar129;
            auVar62._12_4_ = auVar90._12_4_ * fVar130;
            auVar62._16_4_ = auVar90._16_4_ * 0.0;
            auVar62._20_4_ = auVar90._20_4_ * 0.0;
            auVar62._24_4_ = auVar90._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar62,auVar118,auVar102);
            auVar154._0_4_ = fVar125 * auVar102._0_4_;
            auVar154._4_4_ = fVar128 * auVar102._4_4_;
            auVar154._8_4_ = fVar127 * auVar102._8_4_;
            auVar154._12_4_ = fVar131 * auVar102._12_4_;
            auVar154._16_4_ = auVar102._16_4_ * 0.0;
            auVar154._20_4_ = auVar102._20_4_ * 0.0;
            auVar154._24_4_ = auVar102._24_4_ * 0.0;
            auVar154._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar154,auVar101,auVar89);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar99,ZEXT1632(auVar82));
            auVar157._0_4_ = auVar89._0_4_ * auVar118._0_4_;
            auVar157._4_4_ = auVar89._4_4_ * auVar118._4_4_;
            auVar157._8_4_ = auVar89._8_4_ * auVar118._8_4_;
            auVar157._12_4_ = auVar89._12_4_ * auVar118._12_4_;
            auVar157._16_4_ = auVar89._16_4_ * fVar161;
            auVar157._20_4_ = auVar89._20_4_ * fVar132;
            auVar157._24_4_ = auVar89._24_4_ * fVar136;
            auVar157._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar157,auVar95,auVar90);
            auVar96 = vfmadd231ps_avx512vl(auVar92,auVar99,ZEXT1632(auVar82));
            auVar92 = vmulps_avx512vl(auVar93,auVar119);
            auVar92 = vfmsub231ps_avx512vl(auVar92,auVar91,auVar121);
            auVar63._4_4_ = auVar94._4_4_ * auVar121._4_4_;
            auVar63._0_4_ = auVar94._0_4_ * auVar121._0_4_;
            auVar63._8_4_ = auVar94._8_4_ * auVar121._8_4_;
            auVar63._12_4_ = auVar94._12_4_ * auVar121._12_4_;
            auVar63._16_4_ = auVar94._16_4_ * fVar150;
            auVar63._20_4_ = auVar94._20_4_ * fVar80;
            auVar63._24_4_ = auVar94._24_4_ * fVar79;
            auVar63._28_4_ = iVar2;
            auVar82 = vfmsub231ps_fma(auVar63,auVar120,auVar93);
            auVar158._0_4_ = auVar120._0_4_ * auVar91._0_4_;
            auVar158._4_4_ = auVar120._4_4_ * auVar91._4_4_;
            auVar158._8_4_ = auVar120._8_4_ * auVar91._8_4_;
            auVar158._12_4_ = auVar120._12_4_ * auVar91._12_4_;
            auVar158._16_4_ = fVar137 * auVar91._16_4_;
            auVar158._20_4_ = fVar138 * auVar91._20_4_;
            auVar158._24_4_ = fVar163 * auVar91._24_4_;
            auVar158._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar158,auVar94,auVar119);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar99,auVar92);
            auVar88 = vfmadd231ps_avx512vl(auVar92,auVar99,ZEXT1632(auVar82));
            auVar92 = vmaxps_avx(auVar96,auVar88);
            uVar139 = vcmpps_avx512vl(auVar92,auVar99,2);
            bVar78 = bVar78 & (byte)uVar139;
            if (bVar78 != 0) {
              auVar64._4_4_ = auVar93._4_4_ * auVar89._4_4_;
              auVar64._0_4_ = auVar93._0_4_ * auVar89._0_4_;
              auVar64._8_4_ = auVar93._8_4_ * auVar89._8_4_;
              auVar64._12_4_ = auVar93._12_4_ * auVar89._12_4_;
              auVar64._16_4_ = auVar93._16_4_ * auVar89._16_4_;
              auVar64._20_4_ = auVar93._20_4_ * auVar89._20_4_;
              auVar64._24_4_ = auVar93._24_4_ * auVar89._24_4_;
              auVar64._28_4_ = auVar92._28_4_;
              auVar8 = vfmsub231ps_fma(auVar64,auVar94,auVar90);
              auVar65._4_4_ = auVar90._4_4_ * auVar91._4_4_;
              auVar65._0_4_ = auVar90._0_4_ * auVar91._0_4_;
              auVar65._8_4_ = auVar90._8_4_ * auVar91._8_4_;
              auVar65._12_4_ = auVar90._12_4_ * auVar91._12_4_;
              auVar65._16_4_ = auVar90._16_4_ * auVar91._16_4_;
              auVar65._20_4_ = auVar90._20_4_ * auVar91._20_4_;
              auVar65._24_4_ = auVar90._24_4_ * auVar91._24_4_;
              auVar65._28_4_ = auVar90._28_4_;
              auVar81 = vfmsub231ps_fma(auVar65,auVar102,auVar93);
              auVar66._4_4_ = auVar94._4_4_ * auVar102._4_4_;
              auVar66._0_4_ = auVar94._0_4_ * auVar102._0_4_;
              auVar66._8_4_ = auVar94._8_4_ * auVar102._8_4_;
              auVar66._12_4_ = auVar94._12_4_ * auVar102._12_4_;
              auVar66._16_4_ = auVar94._16_4_ * auVar102._16_4_;
              auVar66._20_4_ = auVar94._20_4_ * auVar102._20_4_;
              auVar66._24_4_ = auVar94._24_4_ * auVar102._24_4_;
              auVar66._28_4_ = auVar94._28_4_;
              auVar9 = vfmsub231ps_fma(auVar66,auVar91,auVar89);
              auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar9));
              auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar8),auVar99);
              auVar89 = vrcp14ps_avx512vl(auVar92);
              auVar91 = auVar179._0_32_;
              auVar90 = vfnmadd213ps_avx512vl(auVar89,auVar92,auVar91);
              auVar82 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
              auVar67._4_4_ = auVar9._4_4_ * auVar118._4_4_;
              auVar67._0_4_ = auVar9._0_4_ * auVar118._0_4_;
              auVar67._8_4_ = auVar9._8_4_ * auVar118._8_4_;
              auVar67._12_4_ = auVar9._12_4_ * auVar118._12_4_;
              auVar67._16_4_ = fVar161 * 0.0;
              auVar67._20_4_ = fVar132 * 0.0;
              auVar67._24_4_ = fVar136 * 0.0;
              auVar67._28_4_ = iVar1;
              auVar81 = vfmadd231ps_fma(auVar67,auVar95,ZEXT1632(auVar81));
              auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar101,ZEXT1632(auVar8));
              fVar132 = auVar82._0_4_;
              fVar136 = auVar82._4_4_;
              fVar137 = auVar82._8_4_;
              fVar138 = auVar82._12_4_;
              local_220 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar138,
                                             CONCAT48(auVar81._8_4_ * fVar137,
                                                      CONCAT44(auVar81._4_4_ * fVar136,
                                                               auVar81._0_4_ * fVar132))));
              uVar139 = vcmpps_avx512vl(local_220,local_2e0,0xd);
              fVar161 = local_548->tfar;
              auVar31._4_4_ = fVar161;
              auVar31._0_4_ = fVar161;
              auVar31._8_4_ = fVar161;
              auVar31._12_4_ = fVar161;
              auVar31._16_4_ = fVar161;
              auVar31._20_4_ = fVar161;
              auVar31._24_4_ = fVar161;
              auVar31._28_4_ = fVar161;
              uVar24 = vcmpps_avx512vl(local_220,auVar31,2);
              bVar78 = (byte)uVar139 & (byte)uVar24 & bVar78;
              if (bVar78 != 0) {
                uVar139 = vcmpps_avx512vl(auVar92,auVar99,4);
                bVar78 = bVar78 & (byte)uVar139;
                auVar176 = ZEXT3264(local_340);
                if (bVar78 != 0) {
                  fVar161 = auVar96._0_4_ * fVar132;
                  fVar163 = auVar96._4_4_ * fVar136;
                  auVar68._4_4_ = fVar163;
                  auVar68._0_4_ = fVar161;
                  fVar79 = auVar96._8_4_ * fVar137;
                  auVar68._8_4_ = fVar79;
                  fVar80 = auVar96._12_4_ * fVar138;
                  auVar68._12_4_ = fVar80;
                  fVar150 = auVar96._16_4_ * 0.0;
                  auVar68._16_4_ = fVar150;
                  fVar124 = auVar96._20_4_ * 0.0;
                  auVar68._20_4_ = fVar124;
                  fVar125 = auVar96._24_4_ * 0.0;
                  auVar68._24_4_ = fVar125;
                  auVar68._28_4_ = auVar92._28_4_;
                  auVar89 = vsubps_avx512vl(auVar91,auVar68);
                  local_260._0_4_ =
                       (float)((uint)(bVar70 & 1) * (int)fVar161 |
                              (uint)!(bool)(bVar70 & 1) * auVar89._0_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
                  local_260._4_4_ =
                       (float)((uint)bVar18 * (int)fVar163 | (uint)!bVar18 * auVar89._4_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
                  local_260._8_4_ =
                       (float)((uint)bVar18 * (int)fVar79 | (uint)!bVar18 * auVar89._8_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
                  local_260._12_4_ =
                       (float)((uint)bVar18 * (int)fVar80 | (uint)!bVar18 * auVar89._12_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
                  local_260._16_4_ =
                       (float)((uint)bVar18 * (int)fVar150 | (uint)!bVar18 * auVar89._16_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
                  local_260._20_4_ =
                       (float)((uint)bVar18 * (int)fVar124 | (uint)!bVar18 * auVar89._20_4_);
                  bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                  local_260._24_4_ =
                       (float)((uint)bVar18 * (int)fVar125 | (uint)!bVar18 * auVar89._24_4_);
                  bVar18 = SUB81(uVar72 >> 7,0);
                  local_260._28_4_ =
                       (float)((uint)bVar18 * auVar92._28_4_ | (uint)!bVar18 * auVar89._28_4_);
                  auVar92 = vsubps_avx(ZEXT1632(auVar177),auVar86);
                  auVar82 = vfmadd213ps_fma(auVar92,local_260,auVar86);
                  fVar161 = pre->depth_scale;
                  auVar32._4_4_ = fVar161;
                  auVar32._0_4_ = fVar161;
                  auVar32._8_4_ = fVar161;
                  auVar32._12_4_ = fVar161;
                  auVar32._16_4_ = fVar161;
                  auVar32._20_4_ = fVar161;
                  auVar32._24_4_ = fVar161;
                  auVar32._28_4_ = fVar161;
                  auVar92 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                               CONCAT48(auVar82._8_4_ +
                                                                        auVar82._8_4_,
                                                                        CONCAT44(auVar82._4_4_ +
                                                                                 auVar82._4_4_,
                                                                                 auVar82._0_4_ +
                                                                                 auVar82._0_4_)))),
                                            auVar32);
                  uVar139 = vcmpps_avx512vl(local_220,auVar92,6);
                  if (((byte)uVar139 & bVar78) != 0) {
                    auVar7._0_4_ = local_548->tfar;
                    auVar7._4_4_ = local_548->mask;
                    auVar7._8_4_ = local_548->id;
                    auVar7._12_4_ = local_548->flags;
                    uVar71 = vextractps_avx(auVar7,1);
                    auVar143._0_4_ = auVar88._0_4_ * fVar132;
                    auVar143._4_4_ = auVar88._4_4_ * fVar136;
                    auVar143._8_4_ = auVar88._8_4_ * fVar137;
                    auVar143._12_4_ = auVar88._12_4_ * fVar138;
                    auVar143._16_4_ = auVar88._16_4_ * 0.0;
                    auVar143._20_4_ = auVar88._20_4_ * 0.0;
                    auVar143._24_4_ = auVar88._24_4_ * 0.0;
                    auVar143._28_4_ = 0;
                    auVar92 = vsubps_avx512vl(auVar91,auVar143);
                    auVar123._0_4_ =
                         (uint)(bVar70 & 1) * (int)auVar143._0_4_ |
                         (uint)!(bool)(bVar70 & 1) * auVar92._0_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 1) & 1);
                    auVar123._4_4_ =
                         (uint)bVar18 * (int)auVar143._4_4_ | (uint)!bVar18 * auVar92._4_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 2) & 1);
                    auVar123._8_4_ =
                         (uint)bVar18 * (int)auVar143._8_4_ | (uint)!bVar18 * auVar92._8_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
                    auVar123._12_4_ =
                         (uint)bVar18 * (int)auVar143._12_4_ | (uint)!bVar18 * auVar92._12_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
                    auVar123._16_4_ =
                         (uint)bVar18 * (int)auVar143._16_4_ | (uint)!bVar18 * auVar92._16_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 5) & 1);
                    auVar123._20_4_ =
                         (uint)bVar18 * (int)auVar143._20_4_ | (uint)!bVar18 * auVar92._20_4_;
                    bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                    auVar123._24_4_ =
                         (uint)bVar18 * (int)auVar143._24_4_ | (uint)!bVar18 * auVar92._24_4_;
                    auVar123._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar92._28_4_;
                    auVar33._8_4_ = 0x40000000;
                    auVar33._0_8_ = 0x4000000040000000;
                    auVar33._12_4_ = 0x40000000;
                    auVar33._16_4_ = 0x40000000;
                    auVar33._20_4_ = 0x40000000;
                    auVar33._24_4_ = 0x40000000;
                    auVar33._28_4_ = 0x40000000;
                    local_240 = vfmsub132ps_avx512vl(auVar123,auVar91,auVar33);
                    local_200 = (int)lVar75;
                    local_1fc = iVar15;
                    local_1f0 = local_470;
                    local_1e0 = local_480._0_8_;
                    uStack_1d8 = local_480._8_8_;
                    local_1d0 = local_490._0_8_;
                    uStack_1c8 = local_490._8_8_;
                    pGVar16 = (context->scene->geometries).items[local_528].ptr;
                    if ((pGVar16->mask & uVar71) == 0) {
                      bVar70 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar70 = 1, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar82 = vcvtsi2ss_avx512f(auVar87._0_16_,(int)lVar75);
                      fVar161 = auVar82._0_4_;
                      local_1a0[0] = (fVar161 + local_260._0_4_ + 0.0) * (float)local_300._0_4_;
                      local_1a0[1] = (fVar161 + local_260._4_4_ + 1.0) * (float)local_300._4_4_;
                      local_1a0[2] = (fVar161 + local_260._8_4_ + 2.0) * fStack_2f8;
                      local_1a0[3] = (fVar161 + local_260._12_4_ + 3.0) * fStack_2f4;
                      fStack_190 = (fVar161 + local_260._16_4_ + 4.0) * fStack_2f0;
                      fStack_18c = (fVar161 + local_260._20_4_ + 5.0) * fStack_2ec;
                      fStack_188 = (fVar161 + local_260._24_4_ + 6.0) * fStack_2e8;
                      fStack_184 = fVar161 + local_260._28_4_ + 7.0;
                      local_180 = local_240;
                      local_160 = local_220;
                      uVar72 = CONCAT71(0,(byte)uVar139 & bVar78);
                      local_4a0._0_8_ = uVar72;
                      lVar26 = 0;
                      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                        lVar26 = lVar26 + 1;
                      }
                      local_520._0_8_ = lVar26;
                      local_4a8 = context;
                      local_270 = auVar7;
                      local_4b0 = pGVar16;
                      do {
                        auVar177 = auVar178._0_16_;
                        local_4d4 = local_1a0[local_520._0_8_];
                        local_4d0 = *(undefined4 *)(local_180 + local_520._0_8_ * 4);
                        local_548->tfar = *(float *)(local_160 + local_520._0_8_ * 4);
                        local_510.context = local_4a8->user;
                        fVar132 = 1.0 - local_4d4;
                        fVar161 = fVar132 * fVar132 * -3.0;
                        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132)),
                                                  ZEXT416((uint)(local_4d4 * fVar132)),
                                                  ZEXT416(0xc0000000));
                        auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_4d4 * fVar132)),
                                                  ZEXT416((uint)(local_4d4 * local_4d4)),
                                                  ZEXT416(0x40000000));
                        fVar132 = auVar82._0_4_ * 3.0;
                        fVar136 = auVar81._0_4_ * 3.0;
                        fVar137 = local_4d4 * local_4d4 * 3.0;
                        auVar160._0_4_ = fVar137 * (float)local_310._0_4_;
                        auVar160._4_4_ = fVar137 * (float)local_310._4_4_;
                        auVar160._8_4_ = fVar137 * fStack_308;
                        auVar160._12_4_ = fVar137 * fStack_304;
                        auVar146._4_4_ = fVar136;
                        auVar146._0_4_ = fVar136;
                        auVar146._8_4_ = fVar136;
                        auVar146._12_4_ = fVar136;
                        auVar82 = vfmadd132ps_fma(auVar146,auVar160,local_490);
                        auVar152._4_4_ = fVar132;
                        auVar152._0_4_ = fVar132;
                        auVar152._8_4_ = fVar132;
                        auVar152._12_4_ = fVar132;
                        auVar82 = vfmadd132ps_fma(auVar152,auVar82,local_480);
                        auVar147._4_4_ = fVar161;
                        auVar147._0_4_ = fVar161;
                        auVar147._8_4_ = fVar161;
                        auVar147._12_4_ = fVar161;
                        auVar82 = vfmadd213ps_fma(auVar147,local_470,auVar82);
                        local_4e0 = vmovlps_avx(auVar82);
                        local_4d8 = vextractps_avx(auVar82,2);
                        local_4cc = local_52c;
                        local_4c8 = (int)local_528;
                        local_4c4 = (local_510.context)->instID[0];
                        local_4c0 = (local_510.context)->instPrimID[0];
                        local_54c = -1;
                        local_510.valid = &local_54c;
                        local_510.geometryUserPtr = local_4b0->userPtr;
                        local_510.ray = (RTCRayN *)local_548;
                        local_510.hit = (RTCHitN *)&local_4e0;
                        local_510.N = 1;
                        if ((local_4b0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*local_4b0->occlusionFilterN)(&local_510), *local_510.valid != 0)) {
                          p_Var17 = local_4a8->args->filter;
                          if ((p_Var17 == (RTCFilterFunctionN)0x0) ||
                             ((((local_4a8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                               (((local_4b0->field_8).field_0x2 & 0x40) == 0)) ||
                              ((*p_Var17)(&local_510), *local_510.valid != 0)))) {
                            bVar70 = 1;
                            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar179 = ZEXT3264(auVar92);
                            auVar82 = vxorps_avx512vl(auVar177,auVar177);
                            auVar178 = ZEXT1664(auVar82);
                            auVar176 = ZEXT3264(local_340);
                            auVar182 = ZEXT3264(local_360);
                            auVar185 = ZEXT3264(local_3e0);
                            auVar181 = ZEXT3264(local_380);
                            auVar187 = ZEXT3264(local_400);
                            auVar184 = ZEXT3264(local_420);
                            auVar183 = ZEXT3264(local_3a0);
                            auVar186 = ZEXT3264(local_440);
                            auVar180 = ZEXT3264(local_3c0);
                            context = local_4a8;
                            pre = local_538;
                            break;
                          }
                        }
                        local_548->tfar = (float)local_270._0_4_;
                        uVar74 = local_4a0._0_8_ ^ 1L << (local_520._0_8_ & 0x3f);
                        bVar70 = 0;
                        local_4a0._0_8_ = uVar74;
                        lVar26 = 0;
                        for (uVar72 = uVar74; (uVar72 & 1) == 0;
                            uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                          lVar26 = lVar26 + 1;
                        }
                        local_520._0_8_ = lVar26;
                        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar179 = ZEXT3264(auVar92);
                        auVar82 = vxorps_avx512vl(auVar177,auVar177);
                        auVar178 = ZEXT1664(auVar82);
                        auVar176 = ZEXT3264(local_340);
                        auVar182 = ZEXT3264(local_360);
                        auVar185 = ZEXT3264(local_3e0);
                        auVar181 = ZEXT3264(local_380);
                        auVar187 = ZEXT3264(local_400);
                        auVar184 = ZEXT3264(local_420);
                        auVar183 = ZEXT3264(local_3a0);
                        auVar186 = ZEXT3264(local_440);
                        auVar180 = ZEXT3264(local_3c0);
                        context = local_4a8;
                        pre = local_538;
                      } while (uVar74 != 0);
                    }
                    bVar76 = (bool)(bVar76 | bVar70);
                  }
                }
                goto LAB_01c82995;
              }
            }
            auVar176 = ZEXT3264(local_340);
          }
LAB_01c82995:
          lVar75 = lVar75 + 8;
        } while ((int)lVar75 < iVar15);
      }
      if (bVar76) {
        return bVar76;
      }
      fVar161 = local_548->tfar;
      auVar30._4_4_ = fVar161;
      auVar30._0_4_ = fVar161;
      auVar30._8_4_ = fVar161;
      auVar30._12_4_ = fVar161;
      auVar30._16_4_ = fVar161;
      auVar30._20_4_ = fVar161;
      auVar30._24_4_ = fVar161;
      auVar30._28_4_ = fVar161;
      uVar139 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar71 = (uint)uVar77 & (uint)uVar139;
      uVar77 = (ulong)uVar71;
      ray = local_548;
    } while (uVar71 != 0);
  }
  return bVar76;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }